

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_hn<embree::sse2::OrientedCurve1Intersector1<embree::HermiteCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Primitive PVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  __int_type_conflict _Var18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined3 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined8 uVar31;
  undefined6 uVar32;
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  byte bVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  RTCFilterFunctionN p_Var58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  bool bVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  undefined2 uVar106;
  float fVar70;
  float fVar107;
  float fVar108;
  vfloat_impl<4> p00;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  float fVar109;
  float fVar133;
  float fVar134;
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  float fVar147;
  float fVar148;
  vfloat4 v;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar157;
  float fVar158;
  vfloat4 v_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar159;
  float fVar170;
  float fVar171;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar172;
  float fVar198;
  float fVar199;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar200;
  float fVar203;
  float fVar204;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar218;
  float fVar219;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar220;
  float fVar221;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar261;
  float fVar264;
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  float fVar262;
  float fVar263;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar281;
  float fVar284;
  vfloat4 a;
  undefined1 auVar272 [16];
  undefined1 auVar275 [16];
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar301;
  float fVar304;
  vfloat4 a_2;
  float fVar307;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar296 [16];
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar308;
  float fVar309;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar310;
  float fVar311;
  float fVar321;
  float fVar323;
  float fVar325;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar316 [16];
  float fVar322;
  float fVar324;
  float fVar326;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined8 local_3f8;
  undefined4 local_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  undefined8 uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  ulong local_278;
  Primitive *local_270;
  RTCFilterFunctionNArguments local_268;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float afStack_1e8 [4];
  undefined8 local_1d8;
  float local_1d0;
  float local_1cc;
  float fStack_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar103 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 uVar105;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  
  PVar12 = prim[1];
  uVar55 = (ulong)(byte)PVar12;
  lVar21 = uVar55 * 0x25;
  pPVar4 = prim + lVar21 + 6;
  fVar148 = *(float *)(pPVar4 + 0xc);
  fVar149 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar148;
  fVar157 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar148;
  fVar158 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar148;
  fVar135 = fVar148 * (ray->dir).field_0.m128[0];
  fVar147 = fVar148 * (ray->dir).field_0.m128[1];
  fVar148 = fVar148 * (ray->dir).field_0.m128[2];
  uVar13 = *(undefined4 *)(prim + uVar55 * 4 + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar56;
  auVar123._12_2_ = uVar106;
  auVar123._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar137._12_4_ = auVar123._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar56;
  auVar137._10_2_ = uVar106;
  auVar71._10_6_ = auVar137._10_6_;
  auVar71._8_2_ = uVar106;
  auVar71._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar33._4_8_ = auVar71._8_8_;
  auVar33._2_2_ = uVar106;
  auVar33._0_2_ = uVar106;
  fVar327 = (float)((int)sVar69 >> 8);
  fVar334 = (float)(auVar33._0_4_ >> 0x18);
  fVar336 = (float)(auVar71._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar55 * 5 + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar56;
  auVar112._12_2_ = uVar106;
  auVar112._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar56;
  auVar111._10_2_ = uVar106;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar106;
  auVar110._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar34._4_8_ = auVar110._8_8_;
  auVar34._2_2_ = uVar106;
  auVar34._0_2_ = uVar106;
  fVar159 = (float)((int)sVar69 >> 8);
  fVar170 = (float)(auVar34._0_4_ >> 0x18);
  fVar171 = (float)(auVar110._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar55 * 6 + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar56;
  auVar115._12_2_ = uVar106;
  auVar115._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar56;
  auVar114._10_2_ = uVar106;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar106;
  auVar113._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar35._4_8_ = auVar113._8_8_;
  auVar35._2_2_ = uVar106;
  auVar35._0_2_ = uVar106;
  fVar200 = (float)((int)sVar69 >> 8);
  fVar203 = (float)(auVar35._0_4_ >> 0x18);
  fVar204 = (float)(auVar113._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar55 * 0xf + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar118._8_4_ = 0;
  auVar118._0_8_ = uVar56;
  auVar118._12_2_ = uVar106;
  auVar118._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_2_ = 0;
  auVar117._0_8_ = uVar56;
  auVar117._10_2_ = uVar106;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._8_2_ = uVar106;
  auVar116._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar36._4_8_ = auVar116._8_8_;
  auVar36._2_2_ = uVar106;
  auVar36._0_2_ = uVar106;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar107 = (float)(auVar36._0_4_ >> 0x18);
  fVar108 = (float)(auVar116._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar56;
  auVar175._12_2_ = uVar106;
  auVar175._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar56;
  auVar174._10_2_ = uVar106;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar106;
  auVar173._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar37._4_8_ = auVar173._8_8_;
  auVar37._2_2_ = uVar106;
  auVar37._0_2_ = uVar106;
  fVar205 = (float)((int)sVar69 >> 8);
  fVar218 = (float)(auVar37._0_4_ >> 0x18);
  fVar219 = (float)(auVar173._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar55 + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar56;
  auVar178._12_2_ = uVar106;
  auVar178._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar56;
  auVar177._10_2_ = uVar106;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar106;
  auVar176._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar38._4_8_ = auVar176._8_8_;
  auVar38._2_2_ = uVar106;
  auVar38._0_2_ = uVar106;
  fVar247 = (float)((int)sVar69 >> 8);
  fVar261 = (float)(auVar38._0_4_ >> 0x18);
  fVar264 = (float)(auVar176._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar55 * 0x1a + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar56;
  auVar181._12_2_ = uVar106;
  auVar181._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar56;
  auVar180._10_2_ = uVar106;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar106;
  auVar179._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar39._4_8_ = auVar179._8_8_;
  auVar39._2_2_ = uVar106;
  auVar39._0_2_ = uVar106;
  fVar220 = (float)((int)sVar69 >> 8);
  fVar231 = (float)(auVar39._0_4_ >> 0x18);
  fVar236 = (float)(auVar179._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar55 * 0x1b + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar56;
  auVar184._12_2_ = uVar106;
  auVar184._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar56;
  auVar183._10_2_ = uVar106;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar106;
  auVar182._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar40._4_8_ = auVar182._8_8_;
  auVar40._2_2_ = uVar106;
  auVar40._0_2_ = uVar106;
  fVar269 = (float)((int)sVar69 >> 8);
  fVar281 = (float)(auVar40._0_4_ >> 0x18);
  fVar284 = (float)(auVar182._8_4_ >> 0x18);
  uVar13 = *(undefined4 *)(prim + uVar55 * 0x1c + 6);
  uVar105 = (undefined1)((uint)uVar13 >> 0x18);
  uVar106 = CONCAT11(uVar105,uVar105);
  uVar105 = (undefined1)((uint)uVar13 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar106,uVar105),CONCAT14(uVar105,uVar13));
  uVar105 = (undefined1)((uint)uVar13 >> 8);
  uVar32 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar105),uVar105);
  sVar69 = CONCAT11((char)uVar13,(char)uVar13);
  uVar56 = CONCAT62(uVar32,sVar69);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar56;
  auVar187._12_2_ = uVar106;
  auVar187._14_2_ = uVar106;
  uVar106 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar56;
  auVar186._10_2_ = uVar106;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar106;
  auVar185._0_8_ = uVar56;
  uVar106 = (undefined2)uVar32;
  auVar41._4_8_ = auVar185._8_8_;
  auVar41._2_2_ = uVar106;
  auVar41._0_2_ = uVar106;
  fVar109 = (float)((int)sVar69 >> 8);
  fVar133 = (float)(auVar41._0_4_ >> 0x18);
  fVar134 = (float)(auVar185._8_4_ >> 0x18);
  fVar310 = fVar135 * fVar327 + fVar147 * fVar159 + fVar148 * fVar200;
  fVar321 = fVar135 * fVar334 + fVar147 * fVar170 + fVar148 * fVar203;
  fVar323 = fVar135 * fVar336 + fVar147 * fVar171 + fVar148 * fVar204;
  fVar325 = fVar135 * (float)(auVar137._12_4_ >> 0x18) +
            fVar147 * (float)(auVar111._12_4_ >> 0x18) + fVar148 * (float)(auVar114._12_4_ >> 0x18);
  fVar289 = fVar135 * fVar70 + fVar147 * fVar205 + fVar148 * fVar247;
  fVar301 = fVar135 * fVar107 + fVar147 * fVar218 + fVar148 * fVar261;
  fVar304 = fVar135 * fVar108 + fVar147 * fVar219 + fVar148 * fVar264;
  fVar307 = fVar135 * (float)(auVar117._12_4_ >> 0x18) +
            fVar147 * (float)(auVar174._12_4_ >> 0x18) + fVar148 * (float)(auVar177._12_4_ >> 0x18);
  fVar172 = fVar135 * fVar220 + fVar147 * fVar269 + fVar148 * fVar109;
  fVar198 = fVar135 * fVar231 + fVar147 * fVar281 + fVar148 * fVar133;
  fVar199 = fVar135 * fVar236 + fVar147 * fVar284 + fVar148 * fVar134;
  fVar135 = fVar135 * (float)(auVar180._12_4_ >> 0x18) +
            fVar147 * (float)(auVar183._12_4_ >> 0x18) + fVar148 * (float)(auVar186._12_4_ >> 0x18);
  fVar328 = fVar327 * fVar149 + fVar159 * fVar157 + fVar200 * fVar158;
  fVar334 = fVar334 * fVar149 + fVar170 * fVar157 + fVar203 * fVar158;
  fVar336 = fVar336 * fVar149 + fVar171 * fVar157 + fVar204 * fVar158;
  fVar338 = (float)(auVar137._12_4_ >> 0x18) * fVar149 +
            (float)(auVar111._12_4_ >> 0x18) * fVar157 + (float)(auVar114._12_4_ >> 0x18) * fVar158;
  fVar247 = fVar70 * fVar149 + fVar205 * fVar157 + fVar247 * fVar158;
  fVar261 = fVar107 * fVar149 + fVar218 * fVar157 + fVar261 * fVar158;
  fVar264 = fVar108 * fVar149 + fVar219 * fVar157 + fVar264 * fVar158;
  fVar327 = (float)(auVar117._12_4_ >> 0x18) * fVar149 +
            (float)(auVar174._12_4_ >> 0x18) * fVar157 + (float)(auVar177._12_4_ >> 0x18) * fVar158;
  fVar220 = fVar149 * fVar220 + fVar157 * fVar269 + fVar158 * fVar109;
  fVar231 = fVar149 * fVar231 + fVar157 * fVar281 + fVar158 * fVar133;
  fVar236 = fVar149 * fVar236 + fVar157 * fVar284 + fVar158 * fVar134;
  fVar269 = fVar149 * (float)(auVar180._12_4_ >> 0x18) +
            fVar157 * (float)(auVar183._12_4_ >> 0x18) + fVar158 * (float)(auVar186._12_4_ >> 0x18);
  fVar148 = (float)DAT_01f80d30;
  fVar70 = DAT_01f80d30._4_4_;
  fVar107 = DAT_01f80d30._8_4_;
  fVar108 = DAT_01f80d30._12_4_;
  uVar63 = -(uint)(fVar148 <= ABS(fVar310));
  uVar65 = -(uint)(fVar70 <= ABS(fVar321));
  uVar67 = -(uint)(fVar107 <= ABS(fVar323));
  uVar68 = -(uint)(fVar108 <= ABS(fVar325));
  auVar312._0_4_ = (uint)fVar310 & uVar63;
  auVar312._4_4_ = (uint)fVar321 & uVar65;
  auVar312._8_4_ = (uint)fVar323 & uVar67;
  auVar312._12_4_ = (uint)fVar325 & uVar68;
  auVar150._0_4_ = ~uVar63 & (uint)fVar148;
  auVar150._4_4_ = ~uVar65 & (uint)fVar70;
  auVar150._8_4_ = ~uVar67 & (uint)fVar107;
  auVar150._12_4_ = ~uVar68 & (uint)fVar108;
  auVar150 = auVar150 | auVar312;
  uVar63 = -(uint)(fVar148 <= ABS(fVar289));
  uVar65 = -(uint)(fVar70 <= ABS(fVar301));
  uVar67 = -(uint)(fVar107 <= ABS(fVar304));
  uVar68 = -(uint)(fVar108 <= ABS(fVar307));
  auVar292._0_4_ = (uint)fVar289 & uVar63;
  auVar292._4_4_ = (uint)fVar301 & uVar65;
  auVar292._8_4_ = (uint)fVar304 & uVar67;
  auVar292._12_4_ = (uint)fVar307 & uVar68;
  auVar201._0_4_ = ~uVar63 & (uint)fVar148;
  auVar201._4_4_ = ~uVar65 & (uint)fVar70;
  auVar201._8_4_ = ~uVar67 & (uint)fVar107;
  auVar201._12_4_ = ~uVar68 & (uint)fVar108;
  auVar201 = auVar201 | auVar292;
  uVar63 = -(uint)(fVar148 <= ABS(fVar172));
  uVar65 = -(uint)(fVar70 <= ABS(fVar198));
  uVar67 = -(uint)(fVar107 <= ABS(fVar199));
  uVar68 = -(uint)(fVar108 <= ABS(fVar135));
  auVar188._0_4_ = (uint)fVar172 & uVar63;
  auVar188._4_4_ = (uint)fVar198 & uVar65;
  auVar188._8_4_ = (uint)fVar199 & uVar67;
  auVar188._12_4_ = (uint)fVar135 & uVar68;
  auVar206._0_4_ = ~uVar63 & (uint)fVar148;
  auVar206._4_4_ = ~uVar65 & (uint)fVar70;
  auVar206._8_4_ = ~uVar67 & (uint)fVar107;
  auVar206._12_4_ = ~uVar68 & (uint)fVar108;
  auVar206 = auVar206 | auVar188;
  auVar71 = rcpps(_DAT_01f80d30,auVar150);
  fVar148 = auVar71._0_4_;
  fVar108 = auVar71._4_4_;
  fVar159 = auVar71._8_4_;
  fVar205 = auVar71._12_4_;
  fVar148 = (1.0 - auVar150._0_4_ * fVar148) * fVar148 + fVar148;
  fVar108 = (1.0 - auVar150._4_4_ * fVar108) * fVar108 + fVar108;
  fVar159 = (1.0 - auVar150._8_4_ * fVar159) * fVar159 + fVar159;
  fVar205 = (1.0 - auVar150._12_4_ * fVar205) * fVar205 + fVar205;
  auVar71 = rcpps(auVar71,auVar201);
  fVar70 = auVar71._0_4_;
  fVar109 = auVar71._4_4_;
  fVar170 = auVar71._8_4_;
  fVar218 = auVar71._12_4_;
  fVar70 = (1.0 - auVar201._0_4_ * fVar70) * fVar70 + fVar70;
  fVar109 = (1.0 - auVar201._4_4_ * fVar109) * fVar109 + fVar109;
  fVar170 = (1.0 - auVar201._8_4_ * fVar170) * fVar170 + fVar170;
  fVar218 = (1.0 - auVar201._12_4_ * fVar218) * fVar218 + fVar218;
  auVar71 = rcpps(auVar71,auVar206);
  fVar107 = auVar71._0_4_;
  fVar133 = auVar71._4_4_;
  fVar171 = auVar71._8_4_;
  fVar219 = auVar71._12_4_;
  fVar107 = (1.0 - auVar206._0_4_ * fVar107) * fVar107 + fVar107;
  fVar133 = (1.0 - auVar206._4_4_ * fVar133) * fVar133 + fVar133;
  fVar171 = (1.0 - auVar206._8_4_ * fVar171) * fVar171 + fVar171;
  fVar219 = (1.0 - auVar206._12_4_ * fVar219) * fVar219 + fVar219;
  fVar281 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar21 + 0x16)) *
            *(float *)(prim + lVar21 + 0x1a);
  uVar56 = *(ulong *)(prim + uVar55 * 7 + 6);
  uVar106 = (undefined2)(uVar56 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar56;
  auVar72._12_2_ = uVar106;
  auVar72._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar56 >> 0x20);
  auVar255._12_4_ = auVar72._12_4_;
  auVar255._8_2_ = 0;
  auVar255._0_8_ = uVar56;
  auVar255._10_2_ = uVar106;
  auVar139._10_6_ = auVar255._10_6_;
  auVar139._8_2_ = uVar106;
  auVar139._0_8_ = uVar56;
  uVar106 = (undefined2)(uVar56 >> 0x10);
  auVar42._4_8_ = auVar139._8_8_;
  auVar42._2_2_ = uVar106;
  auVar42._0_2_ = uVar106;
  fVar134 = (float)(auVar42._0_4_ >> 0x10);
  fVar172 = (float)(auVar139._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar55 * 0xb + 6);
  uVar106 = (undefined2)(uVar57 >> 0x30);
  auVar153._8_4_ = 0;
  auVar153._0_8_ = uVar57;
  auVar153._12_2_ = uVar106;
  auVar153._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar57 >> 0x20);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._8_2_ = 0;
  auVar152._0_8_ = uVar57;
  auVar152._10_2_ = uVar106;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._8_2_ = uVar106;
  auVar151._0_8_ = uVar57;
  uVar106 = (undefined2)(uVar57 >> 0x10);
  auVar43._4_8_ = auVar151._8_8_;
  auVar43._2_2_ = uVar106;
  auVar43._0_2_ = uVar106;
  uVar60 = *(ulong *)(prim + uVar55 * 9 + 6);
  uVar106 = (undefined2)(uVar60 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar60;
  auVar75._12_2_ = uVar106;
  auVar75._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar60 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar60;
  auVar74._10_2_ = uVar106;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar106;
  auVar73._0_8_ = uVar60;
  uVar106 = (undefined2)(uVar60 >> 0x10);
  auVar44._4_8_ = auVar73._8_8_;
  auVar44._2_2_ = uVar106;
  auVar44._0_2_ = uVar106;
  fVar135 = (float)(auVar44._0_4_ >> 0x10);
  fVar198 = (float)(auVar73._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar55 * 0xd + 6);
  uVar106 = (undefined2)(uVar5 >> 0x30);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar5;
  auVar209._12_2_ = uVar106;
  auVar209._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar5 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar5;
  auVar208._10_2_ = uVar106;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar106;
  auVar207._0_8_ = uVar5;
  uVar106 = (undefined2)(uVar5 >> 0x10);
  auVar45._4_8_ = auVar207._8_8_;
  auVar45._2_2_ = uVar106;
  auVar45._0_2_ = uVar106;
  uVar6 = *(ulong *)(prim + uVar55 * 0x12 + 6);
  uVar106 = (undefined2)(uVar6 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar6;
  auVar78._12_2_ = uVar106;
  auVar78._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar6 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar6;
  auVar77._10_2_ = uVar106;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar106;
  auVar76._0_8_ = uVar6;
  uVar106 = (undefined2)(uVar6 >> 0x10);
  auVar46._4_8_ = auVar76._8_8_;
  auVar46._2_2_ = uVar106;
  auVar46._0_2_ = uVar106;
  fVar147 = (float)(auVar46._0_4_ >> 0x10);
  fVar199 = (float)(auVar76._8_4_ >> 0x10);
  uVar61 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  uVar7 = *(ulong *)(prim + uVar55 * 2 + uVar61 + 6);
  uVar106 = (undefined2)(uVar7 >> 0x30);
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar7;
  auVar252._12_2_ = uVar106;
  auVar252._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar7 >> 0x20);
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._8_2_ = 0;
  auVar251._0_8_ = uVar7;
  auVar251._10_2_ = uVar106;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._8_2_ = uVar106;
  auVar250._0_8_ = uVar7;
  uVar106 = (undefined2)(uVar7 >> 0x10);
  auVar47._4_8_ = auVar250._8_8_;
  auVar47._2_2_ = uVar106;
  auVar47._0_2_ = uVar106;
  uVar61 = *(ulong *)(prim + uVar61 + 6);
  uVar106 = (undefined2)(uVar61 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar61;
  auVar81._12_2_ = uVar106;
  auVar81._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar61 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar61;
  auVar80._10_2_ = uVar106;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar106;
  auVar79._0_8_ = uVar61;
  uVar106 = (undefined2)(uVar61 >> 0x10);
  auVar48._4_8_ = auVar79._8_8_;
  auVar48._2_2_ = uVar106;
  auVar48._0_2_ = uVar106;
  fVar149 = (float)(auVar48._0_4_ >> 0x10);
  fVar200 = (float)(auVar79._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar55 * 0x18 + 6);
  uVar106 = (undefined2)(uVar8 >> 0x30);
  auVar274._8_4_ = 0;
  auVar274._0_8_ = uVar8;
  auVar274._12_2_ = uVar106;
  auVar274._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar8 >> 0x20);
  auVar273._12_4_ = auVar274._12_4_;
  auVar273._8_2_ = 0;
  auVar273._0_8_ = uVar8;
  auVar273._10_2_ = uVar106;
  auVar272._10_6_ = auVar273._10_6_;
  auVar272._8_2_ = uVar106;
  auVar272._0_8_ = uVar8;
  uVar106 = (undefined2)(uVar8 >> 0x10);
  auVar49._4_8_ = auVar272._8_8_;
  auVar49._2_2_ = uVar106;
  auVar49._0_2_ = uVar106;
  uVar9 = *(ulong *)(prim + uVar55 * 0x1d + 6);
  uVar106 = (undefined2)(uVar9 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar9;
  auVar84._12_2_ = uVar106;
  auVar84._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar9 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar9;
  auVar83._10_2_ = uVar106;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar106;
  auVar82._0_8_ = uVar9;
  uVar106 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar82._8_8_;
  auVar50._2_2_ = uVar106;
  auVar50._0_2_ = uVar106;
  fVar157 = (float)(auVar50._0_4_ >> 0x10);
  fVar203 = (float)(auVar82._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar55 + (ulong)(byte)PVar12 * 0x20 + 6);
  uVar106 = (undefined2)(uVar10 >> 0x30);
  auVar295._8_4_ = 0;
  auVar295._0_8_ = uVar10;
  auVar295._12_2_ = uVar106;
  auVar295._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar10 >> 0x20);
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._8_2_ = 0;
  auVar294._0_8_ = uVar10;
  auVar294._10_2_ = uVar106;
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._8_2_ = uVar106;
  auVar293._0_8_ = uVar10;
  uVar106 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar293._8_8_;
  auVar51._2_2_ = uVar106;
  auVar51._0_2_ = uVar106;
  uVar11 = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar55) + 6);
  uVar106 = (undefined2)(uVar11 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar11;
  auVar87._12_2_ = uVar106;
  auVar87._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar11 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar11;
  auVar86._10_2_ = uVar106;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar106;
  auVar85._0_8_ = uVar11;
  uVar106 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar85._8_8_;
  auVar52._2_2_ = uVar106;
  auVar52._0_2_ = uVar106;
  fVar158 = (float)(auVar52._0_4_ >> 0x10);
  fVar204 = (float)(auVar85._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar55 * 0x23 + 6);
  uVar106 = (undefined2)(uVar55 >> 0x30);
  auVar315._8_4_ = 0;
  auVar315._0_8_ = uVar55;
  auVar315._12_2_ = uVar106;
  auVar315._14_2_ = uVar106;
  uVar106 = (undefined2)(uVar55 >> 0x20);
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._8_2_ = 0;
  auVar314._0_8_ = uVar55;
  auVar314._10_2_ = uVar106;
  auVar313._10_6_ = auVar314._10_6_;
  auVar313._8_2_ = uVar106;
  auVar313._0_8_ = uVar55;
  uVar106 = (undefined2)(uVar55 >> 0x10);
  auVar53._4_8_ = auVar313._8_8_;
  auVar53._2_2_ = uVar106;
  auVar53._0_2_ = uVar106;
  auVar154._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar134) * fVar281 + fVar134) - fVar334) *
                fVar108,((((float)(int)(short)uVar57 - (float)(int)(short)uVar56) * fVar281 +
                         (float)(int)(short)uVar56) - fVar328) * fVar148);
  auVar154._8_4_ =
       ((((float)(auVar151._8_4_ >> 0x10) - fVar172) * fVar281 + fVar172) - fVar336) * fVar159;
  auVar154._12_4_ =
       ((((float)(auVar152._12_4_ >> 0x10) - (float)(auVar255._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar255._12_4_ >> 0x10)) - fVar338) * fVar205;
  auVar210._0_4_ =
       ((((float)(int)(short)uVar5 - (float)(int)(short)uVar60) * fVar281 +
        (float)(int)(short)uVar60) - fVar328) * fVar148;
  auVar210._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar135) * fVar281 + fVar135) - fVar334) * fVar108;
  auVar210._8_4_ =
       ((((float)(auVar207._8_4_ >> 0x10) - fVar198) * fVar281 + fVar198) - fVar336) * fVar159;
  auVar210._12_4_ =
       ((((float)(auVar208._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar338) * fVar205;
  auVar253._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar147) * fVar281 + fVar147) - fVar261) *
                fVar109,((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar281 +
                         (float)(int)(short)uVar6) - fVar247) * fVar70);
  auVar253._8_4_ =
       ((((float)(auVar250._8_4_ >> 0x10) - fVar199) * fVar281 + fVar199) - fVar264) * fVar170;
  auVar253._12_4_ =
       ((((float)(auVar251._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar327) * fVar218;
  auVar275._0_4_ =
       ((((float)(int)(short)uVar8 - (float)(int)(short)uVar61) * fVar281 +
        (float)(int)(short)uVar61) - fVar247) * fVar70;
  auVar275._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar149) * fVar281 + fVar149) - fVar261) * fVar109;
  auVar275._8_4_ =
       ((((float)(auVar272._8_4_ >> 0x10) - fVar200) * fVar281 + fVar200) - fVar264) * fVar170;
  auVar275._12_4_ =
       ((((float)(auVar273._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar327) * fVar218;
  auVar296._0_8_ =
       CONCAT44(((((float)(auVar51._0_4_ >> 0x10) - fVar157) * fVar281 + fVar157) - fVar231) *
                fVar133,((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar281 +
                         (float)(int)(short)uVar9) - fVar220) * fVar107);
  auVar296._8_4_ =
       ((((float)(auVar293._8_4_ >> 0x10) - fVar203) * fVar281 + fVar203) - fVar236) * fVar171;
  auVar296._12_4_ =
       ((((float)(auVar294._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar269) * fVar219;
  auVar316._0_4_ =
       ((((float)(int)(short)uVar55 - (float)(int)(short)uVar11) * fVar281 +
        (float)(int)(short)uVar11) - fVar220) * fVar107;
  auVar316._4_4_ =
       ((((float)(auVar53._0_4_ >> 0x10) - fVar158) * fVar281 + fVar158) - fVar231) * fVar133;
  auVar316._8_4_ =
       ((((float)(auVar313._8_4_ >> 0x10) - fVar204) * fVar281 + fVar204) - fVar236) * fVar171;
  auVar316._12_4_ =
       ((((float)(auVar314._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar269) * fVar219;
  auVar136._8_4_ = auVar154._8_4_;
  auVar136._0_8_ = auVar154._0_8_;
  auVar136._12_4_ = auVar154._12_4_;
  auVar137 = minps(auVar136,auVar210);
  auVar88._8_4_ = auVar253._8_4_;
  auVar88._0_8_ = auVar253._0_8_;
  auVar88._12_4_ = auVar253._12_4_;
  auVar71 = minps(auVar88,auVar275);
  auVar137 = maxps(auVar137,auVar71);
  auVar89._8_4_ = auVar296._8_4_;
  auVar89._0_8_ = auVar296._0_8_;
  auVar89._12_4_ = auVar296._12_4_;
  auVar71 = minps(auVar89,auVar316);
  uVar13 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar119._4_4_ = uVar13;
  auVar119._0_4_ = uVar13;
  auVar119._8_4_ = uVar13;
  auVar119._12_4_ = uVar13;
  auVar71 = maxps(auVar71,auVar119);
  auVar71 = maxps(auVar137,auVar71);
  local_168 = auVar71._0_4_ * 0.99999964;
  fStack_164 = auVar71._4_4_ * 0.99999964;
  fStack_160 = auVar71._8_4_ * 0.99999964;
  fStack_15c = auVar71._12_4_ * 0.99999964;
  auVar71 = maxps(auVar154,auVar210);
  auVar137 = maxps(auVar253,auVar275);
  auVar71 = minps(auVar71,auVar137);
  auVar137 = maxps(auVar296,auVar316);
  fVar148 = ray->tfar;
  auVar90._4_4_ = fVar148;
  auVar90._0_4_ = fVar148;
  auVar90._8_4_ = fVar148;
  auVar90._12_4_ = fVar148;
  auVar137 = minps(auVar137,auVar90);
  auVar71 = minps(auVar71,auVar137);
  uVar63 = (uint)(byte)PVar12;
  auVar120._0_4_ = -(uint)(uVar63 != 0 && local_168 <= auVar71._0_4_ * 1.0000004);
  auVar120._4_4_ = -(uint)(1 < uVar63 && fStack_164 <= auVar71._4_4_ * 1.0000004);
  auVar120._8_4_ = -(uint)(2 < uVar63 && fStack_160 <= auVar71._8_4_ * 1.0000004);
  auVar120._12_4_ = -(uint)(3 < uVar63 && fStack_15c <= auVar71._12_4_ * 1.0000004);
  uVar63 = movmskps(uVar63,auVar120);
  if (uVar63 == 0) {
    uVar56 = 0;
LAB_00b3242a:
    return (bool)((byte)uVar56 & 1);
  }
  uVar63 = uVar63 & 0xff;
  local_158._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_158._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_158._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_158._12_4_ = 0;
  local_270 = prim;
LAB_00b2ff98:
  lVar21 = 0;
  if (uVar63 != 0) {
    for (; (uVar63 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
    }
  }
  local_340 = (ulong)*(uint *)(local_270 + 2);
  uVar65 = *(uint *)(local_270 + lVar21 * 4 + 6);
  pGVar14 = (context->scene->geometries).items[local_340].ptr;
  local_288 = pGVar14->fnumTimeSegments;
  fVar148 = (pGVar14->time_range).lower;
  fVar70 = (((ray->dir).field_0.m128[3] - fVar148) / ((pGVar14->time_range).upper - fVar148)) *
           local_288;
  fVar148 = floorf(fVar70);
  if (local_288 + -1.0 <= fVar148) {
    fVar148 = local_288 + -1.0;
  }
  fVar107 = 0.0;
  if (0.0 <= fVar148) {
    fVar107 = fVar148;
  }
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                           (ulong)uVar65 *
                           pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar59 = (long)(int)fVar107 * 0x38;
  lVar16 = *(long *)(_Var15 + 0x10 + lVar59);
  pfVar1 = (float *)(*(long *)(_Var15 + lVar59) + lVar16 * uVar56);
  fVar148 = *pfVar1;
  fVar108 = pfVar1[1];
  fVar109 = pfVar1[2];
  fVar133 = pfVar1[3];
  lVar21 = uVar56 + 1;
  pfVar1 = (float *)(*(long *)(_Var15 + lVar59) + lVar16 * lVar21);
  fVar134 = *pfVar1;
  fVar135 = pfVar1[1];
  fVar147 = pfVar1[2];
  fVar149 = pfVar1[3];
  p_Var58 = pGVar14[4].occlusionFilterN;
  lVar16 = *(long *)&pGVar14[4].fnumTimeSegments;
  lVar17 = *(long *)(lVar16 + 0x10 + lVar59);
  pfVar1 = (float *)(*(long *)(lVar16 + lVar59) + lVar17 * uVar56);
  fVar157 = *pfVar1;
  fVar158 = pfVar1[1];
  fVar159 = pfVar1[2];
  fVar170 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar16 + lVar59) + lVar17 * lVar21);
  fVar171 = *pfVar1;
  fVar172 = pfVar1[1];
  fVar198 = pfVar1[2];
  fVar199 = pfVar1[3];
  _Var18 = pGVar14[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar17 = *(long *)(_Var18 + 0x10 + lVar59);
  pfVar1 = (float *)(*(long *)(_Var18 + lVar59) + lVar17 * uVar56);
  pfVar2 = (float *)(*(long *)(_Var18 + lVar59) + lVar17 * lVar21);
  pfVar3 = (float *)(*(long *)(p_Var58 + lVar59) + *(long *)(p_Var58 + lVar59 + 0x10) * uVar56);
  fVar70 = fVar70 - fVar107;
  fVar107 = *pfVar3 * 0.33333334 + fVar148;
  fVar200 = pfVar3[1] * 0.33333334 + fVar108;
  fVar203 = pfVar3[2] * 0.33333334 + fVar109;
  fVar204 = pfVar3[3] * 0.33333334 + fVar133;
  pfVar3 = (float *)(*(long *)(p_Var58 + lVar59) + *(long *)(p_Var58 + lVar59 + 0x10) * lVar21);
  fVar220 = fVar134 - *pfVar3 * 0.33333334;
  fVar281 = fVar135 - pfVar3[1] * 0.33333334;
  fVar301 = fVar147 - pfVar3[2] * 0.33333334;
  fVar307 = fVar149 - pfVar3[3] * 0.33333334;
  fVar247 = *pfVar1 * 0.33333334 + fVar157;
  fVar284 = pfVar1[1] * 0.33333334 + fVar158;
  fVar325 = pfVar1[2] * 0.33333334 + fVar159;
  fVar328 = pfVar1[3] * 0.33333334 + fVar170;
  fVar334 = fVar171 - *pfVar2 * 0.33333334;
  fVar338 = fVar172 - pfVar2[1] * 0.33333334;
  fVar237 = fVar198 - pfVar2[2] * 0.33333334;
  fVar242 = fVar199 - pfVar2[3] * 0.33333334;
  fVar205 = fVar220 * 0.0;
  fVar218 = fVar281 * 0.0;
  fVar219 = fVar301 * 0.0;
  fVar264 = fVar307 * 0.0;
  fVar261 = fVar134 * 0.0 + fVar205;
  fVar327 = fVar135 * 0.0 + fVar218;
  fVar231 = fVar147 * 0.0 + fVar219;
  fVar269 = fVar149 * 0.0 + fVar264;
  fVar270 = fVar107 * 0.0;
  fVar282 = fVar200 * 0.0;
  fVar285 = fVar203 * 0.0;
  fVar287 = fVar204 * 0.0;
  fVar236 = fVar270 + fVar261 + fVar148;
  fVar289 = fVar282 + fVar327 + fVar108;
  fVar304 = fVar285 + fVar231 + fVar109;
  fVar310 = fVar287 + fVar269 + fVar133;
  fVar261 = (fVar107 * 3.0 + fVar261) - fVar148 * 3.0;
  fVar327 = (fVar200 * 3.0 + fVar327) - fVar108 * 3.0;
  fVar231 = (fVar203 * 3.0 + fVar231) - fVar109 * 3.0;
  fVar269 = (fVar204 * 3.0 + fVar269) - fVar133 * 3.0;
  fVar271 = fVar334 * 0.0;
  fVar283 = fVar338 * 0.0;
  fVar286 = fVar237 * 0.0;
  fVar288 = fVar242 * 0.0;
  fVar107 = fVar171 * 0.0 + fVar271;
  fVar200 = fVar172 * 0.0 + fVar283;
  fVar203 = fVar198 * 0.0 + fVar286;
  fVar204 = fVar199 * 0.0 + fVar288;
  fVar290 = fVar247 * 0.0;
  fVar302 = fVar284 * 0.0;
  fVar305 = fVar325 * 0.0;
  fVar308 = fVar328 * 0.0;
  fVar336 = fVar290 + fVar107 + fVar157;
  fVar232 = fVar302 + fVar200 + fVar158;
  fVar238 = fVar305 + fVar203 + fVar159;
  fVar243 = fVar308 + fVar204 + fVar170;
  fVar321 = (fVar247 * 3.0 + fVar107) - fVar157 * 3.0;
  fVar323 = (fVar284 * 3.0 + fVar200) - fVar158 * 3.0;
  fVar325 = (fVar325 * 3.0 + fVar203) - fVar159 * 3.0;
  fVar328 = (fVar328 * 3.0 + fVar204) - fVar170 * 3.0;
  fVar204 = fVar205 + fVar134 + fVar270 + fVar148 * 0.0;
  fVar218 = fVar218 + fVar135 + fVar282 + fVar108 * 0.0;
  fVar247 = fVar219 + fVar147 + fVar285 + fVar109 * 0.0;
  fVar284 = fVar264 + fVar149 + fVar287 + fVar133 * 0.0;
  fVar200 = ((fVar134 * 3.0 - fVar220 * 3.0) + fVar270) - fVar148 * 0.0;
  fVar203 = ((fVar135 * 3.0 - fVar281 * 3.0) + fVar282) - fVar108 * 0.0;
  fVar205 = ((fVar147 * 3.0 - fVar301 * 3.0) + fVar285) - fVar109 * 0.0;
  fVar219 = ((fVar149 * 3.0 - fVar307 * 3.0) + fVar287) - fVar133 * 0.0;
  fVar109 = fVar271 + fVar171 + fVar290 + fVar157 * 0.0;
  fVar133 = fVar283 + fVar172 + fVar302 + fVar158 * 0.0;
  fVar134 = fVar286 + fVar198 + fVar305 + fVar159 * 0.0;
  fVar135 = fVar288 + fVar199 + fVar308 + fVar170 * 0.0;
  fVar148 = ((fVar171 * 3.0 - fVar334 * 3.0) + fVar290) - fVar157 * 0.0;
  fVar107 = ((fVar172 * 3.0 - fVar338 * 3.0) + fVar302) - fVar158 * 0.0;
  fVar108 = ((fVar198 * 3.0 - fVar237 * 3.0) + fVar305) - fVar159 * 0.0;
  fVar171 = ((fVar199 * 3.0 - fVar242 * 3.0) + fVar308) - fVar170 * 0.0;
  fVar237 = fVar327 * fVar336 - fVar232 * fVar261;
  fVar242 = fVar231 * fVar232 - fVar238 * fVar327;
  fVar238 = fVar261 * fVar238 - fVar336 * fVar231;
  fVar243 = fVar269 * fVar243 - fVar243 * fVar269;
  fVar220 = fVar327 * fVar321 - fVar323 * fVar261;
  fVar336 = fVar231 * fVar323 - fVar325 * fVar327;
  fVar325 = fVar261 * fVar325 - fVar321 * fVar231;
  fVar307 = fVar203 * fVar109 - fVar133 * fVar200;
  fVar321 = fVar205 * fVar133 - fVar134 * fVar203;
  fVar323 = fVar200 * fVar134 - fVar109 * fVar205;
  fVar334 = fVar219 * fVar135 - fVar135 * fVar219;
  fVar198 = fVar203 * fVar148 - fVar107 * fVar200;
  fVar199 = fVar205 * fVar107 - fVar108 * fVar203;
  fVar301 = fVar200 * fVar108 - fVar148 * fVar205;
  fVar170 = fVar238 * fVar238 + fVar242 * fVar242 + fVar237 * fVar237;
  auVar71 = ZEXT416((uint)fVar170);
  auVar137 = rsqrtss(ZEXT416((uint)fVar170),auVar71);
  fVar148 = auVar137._0_4_;
  fVar338 = fVar148 * 1.5 - fVar148 * fVar148 * fVar170 * 0.5 * fVar148;
  fVar270 = fVar237 * fVar220 + fVar238 * fVar325 + fVar242 * fVar336;
  fVar264 = fVar243 * fVar338;
  auVar71 = rcpss(auVar71,auVar71);
  fVar281 = (2.0 - fVar170 * auVar71._0_4_) * auVar71._0_4_;
  fVar232 = fVar323 * fVar323 + fVar321 * fVar321 + fVar307 * fVar307;
  auVar137 = ZEXT416((uint)fVar232);
  auVar71 = rsqrtss(ZEXT416((uint)fVar232),auVar137);
  fVar148 = auVar71._0_4_;
  fVar271 = fVar148 * 1.5 - fVar148 * fVar148 * fVar232 * 0.5 * fVar148;
  fVar282 = fVar307 * fVar198 + fVar323 * fVar301 + fVar321 * fVar199;
  lVar17 = *(long *)(_Var15 + 0x38 + lVar59);
  lVar19 = *(long *)(_Var15 + 0x48 + lVar59);
  pfVar1 = (float *)(lVar17 + lVar19 * uVar56);
  fVar148 = *pfVar1;
  fVar107 = pfVar1[1];
  fVar108 = pfVar1[2];
  fVar109 = pfVar1[3];
  pfVar1 = (float *)(lVar17 + lVar19 * lVar21);
  fVar133 = *pfVar1;
  fVar134 = pfVar1[1];
  fVar135 = pfVar1[2];
  fVar147 = pfVar1[3];
  lVar17 = *(long *)(lVar16 + 0x38 + lVar59);
  lVar16 = *(long *)(lVar16 + 0x48 + lVar59);
  pfVar1 = (float *)(lVar17 + lVar16 * lVar21);
  fVar149 = *pfVar1;
  fVar157 = pfVar1[1];
  fVar158 = pfVar1[2];
  fVar159 = pfVar1[3];
  lVar19 = *(long *)(_Var18 + 0x38 + lVar59);
  lVar20 = *(long *)(_Var18 + 0x48 + lVar59);
  uVar57 = uVar56 * lVar20;
  auVar71 = rcpss(auVar137,auVar137);
  pfVar1 = (float *)(lVar19 + lVar20 * lVar21);
  fVar172 = fVar334 * fVar271;
  fVar283 = (2.0 - fVar232 * auVar71._0_4_) * auVar71._0_4_;
  fVar329 = fVar310 * fVar242 * fVar338;
  fVar335 = fVar310 * fVar238 * fVar338;
  fVar337 = fVar310 * fVar237 * fVar338;
  fVar339 = fVar310 * fVar264;
  fVar305 = fVar236 - fVar329;
  fVar233 = fVar289 - fVar335;
  fVar239 = fVar304 - fVar337;
  fVar244 = fVar310 - fVar339;
  fVar311 = fVar310 * fVar281 * (fVar170 * fVar336 - fVar270 * fVar242) * fVar338 +
            fVar269 * fVar242 * fVar338;
  fVar322 = fVar310 * fVar281 * (fVar170 * fVar325 - fVar270 * fVar238) * fVar338 +
            fVar269 * fVar238 * fVar338;
  fVar324 = fVar310 * fVar281 * (fVar170 * fVar220 - fVar270 * fVar237) * fVar338 +
            fVar269 * fVar237 * fVar338;
  fVar326 = fVar310 * fVar281 * (fVar170 * (fVar269 * fVar328 - fVar328 * fVar269) -
                                fVar270 * fVar243) * fVar338 + fVar269 * fVar264;
  fVar329 = fVar329 + fVar236;
  fVar335 = fVar335 + fVar289;
  fVar337 = fVar337 + fVar304;
  fVar339 = fVar339 + fVar310;
  fVar264 = fVar284 * fVar321 * fVar271;
  fVar220 = fVar284 * fVar323 * fVar271;
  fVar236 = fVar284 * fVar307 * fVar271;
  fVar281 = fVar284 * fVar172;
  pfVar2 = (float *)(*(long *)(p_Var58 + lVar59 + 0x38) +
                    *(long *)(p_Var58 + lVar59 + 0x48) * lVar21);
  fVar248 = fVar204 - fVar264;
  fVar262 = fVar218 - fVar220;
  fVar265 = fVar247 - fVar236;
  fVar267 = fVar284 - fVar281;
  fVar325 = fVar284 * fVar283 * (fVar232 * fVar199 - fVar282 * fVar321) * fVar271 +
            fVar219 * fVar321 * fVar271;
  fVar336 = fVar284 * fVar283 * (fVar232 * fVar301 - fVar282 * fVar323) * fVar271 +
            fVar219 * fVar323 * fVar271;
  fVar237 = fVar284 * fVar283 * (fVar232 * fVar198 - fVar282 * fVar307) * fVar271 +
            fVar219 * fVar307 * fVar271;
  fVar243 = fVar284 * fVar283 * (fVar232 * (fVar219 * fVar171 - fVar171 * fVar219) -
                                fVar282 * fVar334) * fVar271 + fVar219 * fVar172;
  fVar264 = fVar264 + fVar204;
  fVar220 = fVar220 + fVar218;
  fVar236 = fVar236 + fVar247;
  fVar281 = fVar281 + fVar284;
  fVar284 = fVar133 - *pfVar2 * 0.33333334;
  fVar301 = fVar134 - pfVar2[1] * 0.33333334;
  fVar307 = fVar135 - pfVar2[2] * 0.33333334;
  fVar321 = fVar147 - pfVar2[3] * 0.33333334;
  fVar282 = fVar149 - *pfVar1 * 0.33333334;
  fVar285 = fVar157 - pfVar1[1] * 0.33333334;
  fVar287 = fVar158 - pfVar1[2] * 0.33333334;
  fVar290 = fVar159 - pfVar1[3] * 0.33333334;
  fVar199 = fVar284 * 0.0;
  fVar204 = fVar301 * 0.0;
  fVar218 = fVar307 * 0.0;
  fVar247 = fVar321 * 0.0;
  fVar308 = fVar133 * 0.0 + fVar199;
  fVar234 = fVar134 * 0.0 + fVar204;
  fVar240 = fVar135 * 0.0 + fVar218;
  fVar245 = fVar147 * 0.0 + fVar247;
  pfVar1 = (float *)(*(long *)(p_Var58 + lVar59 + 0x38) +
                    *(long *)(p_Var58 + lVar59 + 0x48) * uVar56);
  fVar170 = *pfVar1 * 0.33333334 + fVar148;
  fVar171 = pfVar1[1] * 0.33333334 + fVar107;
  fVar172 = pfVar1[2] * 0.33333334 + fVar108;
  fVar198 = pfVar1[3] * 0.33333334 + fVar109;
  fVar328 = fVar170 * 0.0;
  fVar338 = fVar171 * 0.0;
  fVar238 = fVar172 * 0.0;
  fVar270 = fVar198 * 0.0;
  fVar289 = (fVar170 * 3.0 + fVar308) - fVar148 * 3.0;
  fVar304 = (fVar171 * 3.0 + fVar234) - fVar107 * 3.0;
  fVar310 = (fVar172 * 3.0 + fVar240) - fVar108 * 3.0;
  fVar323 = (fVar198 * 3.0 + fVar245) - fVar109 * 3.0;
  fVar249 = fVar282 * 0.0;
  fVar263 = fVar285 * 0.0;
  fVar266 = fVar287 * 0.0;
  fVar268 = fVar290 * 0.0;
  fVar221 = fVar149 * 0.0 + fVar249;
  fVar235 = fVar157 * 0.0 + fVar263;
  fVar241 = fVar158 * 0.0 + fVar266;
  fVar246 = fVar159 * 0.0 + fVar268;
  pfVar1 = (float *)(lVar19 + uVar57);
  pfVar2 = (float *)(lVar17 + lVar16 * uVar56);
  fVar170 = *pfVar2;
  fVar171 = pfVar2[1];
  fVar172 = pfVar2[2];
  fVar198 = pfVar2[3];
  fVar334 = *pfVar1 * 0.33333334 + fVar170;
  fVar232 = pfVar1[1] * 0.33333334 + fVar171;
  fVar242 = pfVar1[2] * 0.33333334 + fVar172;
  fVar271 = pfVar1[3] * 0.33333334 + fVar198;
  fVar291 = fVar334 * 0.0;
  fVar303 = fVar232 * 0.0;
  fVar306 = fVar242 * 0.0;
  fVar309 = fVar271 * 0.0;
  fVar283 = (fVar334 * 3.0 + fVar221) - fVar170 * 3.0;
  fVar286 = (fVar232 * 3.0 + fVar235) - fVar171 * 3.0;
  fVar288 = (fVar242 * 3.0 + fVar241) - fVar172 * 3.0;
  fVar302 = (fVar271 * 3.0 + fVar246) - fVar198 * 3.0;
  fVar334 = fVar328 + fVar308 + fVar148;
  fVar232 = fVar338 + fVar234 + fVar107;
  fVar242 = fVar238 + fVar240 + fVar108;
  fVar271 = fVar270 + fVar245 + fVar109;
  fVar199 = fVar199 + fVar133 + fVar328 + fVar148 * 0.0;
  fVar204 = fVar204 + fVar134 + fVar338 + fVar107 * 0.0;
  fVar218 = fVar218 + fVar135 + fVar238 + fVar108 * 0.0;
  fVar247 = fVar247 + fVar147 + fVar270 + fVar109 * 0.0;
  fVar148 = ((fVar133 * 3.0 - fVar284 * 3.0) + fVar328) - fVar148 * 0.0;
  fVar107 = ((fVar134 * 3.0 - fVar301 * 3.0) + fVar338) - fVar107 * 0.0;
  fVar108 = ((fVar135 * 3.0 - fVar307 * 3.0) + fVar238) - fVar108 * 0.0;
  fVar109 = ((fVar147 * 3.0 - fVar321 * 3.0) + fVar270) - fVar109 * 0.0;
  fVar147 = fVar291 + fVar221 + fVar170;
  fVar328 = fVar303 + fVar235 + fVar171;
  fVar238 = fVar306 + fVar241 + fVar172;
  fVar308 = fVar309 + fVar246 + fVar198;
  fVar284 = fVar249 + fVar149 + fVar291 + fVar170 * 0.0;
  fVar301 = fVar263 + fVar157 + fVar303 + fVar171 * 0.0;
  fVar321 = fVar266 + fVar158 + fVar306 + fVar172 * 0.0;
  fVar338 = fVar268 + fVar159 + fVar309 + fVar198 * 0.0;
  fVar133 = ((fVar149 * 3.0 - fVar282 * 3.0) + fVar291) - fVar170 * 0.0;
  fVar134 = ((fVar157 * 3.0 - fVar285 * 3.0) + fVar303) - fVar171 * 0.0;
  fVar135 = ((fVar158 * 3.0 - fVar287 * 3.0) + fVar306) - fVar172 * 0.0;
  fVar307 = ((fVar159 * 3.0 - fVar290 * 3.0) + fVar309) - fVar198 * 0.0;
  fVar171 = fVar304 * fVar147 - fVar328 * fVar289;
  fVar172 = fVar310 * fVar328 - fVar238 * fVar304;
  fVar270 = fVar289 * fVar238 - fVar147 * fVar310;
  fVar290 = fVar323 * fVar308 - fVar308 * fVar323;
  fVar147 = fVar304 * fVar283 - fVar286 * fVar289;
  fVar157 = fVar310 * fVar286 - fVar288 * fVar304;
  fVar159 = fVar289 * fVar288 - fVar283 * fVar310;
  fVar328 = fVar107 * fVar284 - fVar301 * fVar148;
  fVar238 = fVar108 * fVar301 - fVar321 * fVar107;
  fVar282 = fVar148 * fVar321 - fVar284 * fVar108;
  fVar285 = fVar109 * fVar338 - fVar338 * fVar109;
  fVar149 = fVar107 * fVar133 - fVar134 * fVar148;
  fVar158 = fVar108 * fVar134 - fVar135 * fVar107;
  fVar170 = fVar148 * fVar135 - fVar133 * fVar108;
  fVar133 = fVar270 * fVar270 + fVar172 * fVar172 + fVar171 * fVar171;
  auVar71 = ZEXT416((uint)fVar133);
  auVar137 = rsqrtss(ZEXT416((uint)fVar133),auVar71);
  fVar134 = auVar137._0_4_;
  fVar338 = fVar134 * 1.5 - fVar134 * fVar134 * fVar133 * 0.5 * fVar134;
  fVar283 = fVar171 * fVar147 + fVar270 * fVar159 + fVar172 * fVar157;
  auVar71 = rcpss(auVar71,auVar71);
  fVar134 = (2.0 - fVar133 * auVar71._0_4_) * auVar71._0_4_;
  fVar135 = fVar290 * fVar338;
  fVar287 = fVar282 * fVar282 + fVar238 * fVar238 + fVar328 * fVar328;
  auVar71 = ZEXT416((uint)fVar287);
  auVar137 = rsqrtss(ZEXT416((uint)fVar287),auVar71);
  fVar198 = auVar137._0_4_;
  fVar308 = fVar198 * 1.5 - fVar198 * fVar198 * fVar287 * 0.5 * fVar198;
  fVar221 = fVar328 * fVar149 + fVar282 * fVar170 + fVar238 * fVar158;
  auVar71 = rcpss(auVar71,auVar71);
  fVar234 = (2.0 - fVar287 * auVar71._0_4_) * auVar71._0_4_;
  fVar288 = fVar285 * fVar308;
  fVar198 = fVar271 * fVar172 * fVar338;
  fVar284 = fVar271 * fVar270 * fVar338;
  fVar301 = fVar271 * fVar171 * fVar338;
  fVar321 = fVar271 * fVar135;
  fVar157 = fVar271 * fVar134 * (fVar133 * fVar157 - fVar283 * fVar172) * fVar338 +
            fVar323 * fVar172 * fVar338;
  fVar159 = fVar271 * fVar134 * (fVar133 * fVar159 - fVar283 * fVar270) * fVar338 +
            fVar323 * fVar270 * fVar338;
  fVar171 = fVar271 * fVar134 * (fVar133 * fVar147 - fVar283 * fVar171) * fVar338 +
            fVar323 * fVar171 * fVar338;
  fVar172 = fVar271 * fVar134 * (fVar133 * (fVar323 * fVar302 - fVar302 * fVar323) -
                                fVar283 * fVar290) * fVar338 + fVar323 * fVar135;
  fVar338 = fVar334 - fVar198;
  fVar270 = fVar232 - fVar284;
  fVar283 = fVar242 - fVar301;
  fVar286 = fVar271 - fVar321;
  fVar198 = fVar198 + fVar334;
  fVar284 = fVar284 + fVar232;
  fVar301 = fVar301 + fVar242;
  fVar321 = fVar321 + fVar271;
  fVar133 = fVar247 * fVar238 * fVar308;
  fVar134 = fVar247 * fVar282 * fVar308;
  fVar135 = fVar247 * fVar328 * fVar308;
  fVar147 = fVar247 * fVar288;
  fVar334 = fVar247 * fVar234 * (fVar287 * fVar158 - fVar221 * fVar238) * fVar308 +
            fVar109 * fVar238 * fVar308;
  fVar232 = fVar247 * fVar234 * (fVar287 * fVar170 - fVar221 * fVar282) * fVar308 +
            fVar109 * fVar282 * fVar308;
  fVar328 = fVar247 * fVar234 * (fVar287 * fVar149 - fVar221 * fVar328) * fVar308 +
            fVar109 * fVar328 * fVar308;
  fVar238 = fVar247 * fVar234 * (fVar287 * (fVar109 * fVar307 - fVar307 * fVar109) -
                                fVar221 * fVar285) * fVar308 + fVar109 * fVar288;
  fVar149 = fVar199 - fVar133;
  fVar158 = fVar204 - fVar134;
  fVar170 = fVar218 - fVar135;
  fVar307 = fVar247 - fVar147;
  fVar133 = fVar133 + fVar199;
  fVar134 = fVar134 + fVar204;
  fVar135 = fVar135 + fVar218;
  fVar147 = fVar147 + fVar247;
  fVar199 = 1.0 - fVar70;
  local_368 = fVar305 * fVar199 + fVar338 * fVar70;
  fStack_364 = fVar233 * fVar199 + fVar270 * fVar70;
  fStack_360 = fVar239 * fVar199 + fVar283 * fVar70;
  fStack_35c = fVar244 * fVar199 + fVar286 * fVar70;
  local_378 = ((fVar261 - fVar311) * 0.33333334 + fVar305) * fVar199 +
              ((fVar289 - fVar157) * 0.33333334 + fVar338) * fVar70;
  fStack_374 = ((fVar327 - fVar322) * 0.33333334 + fVar233) * fVar199 +
               ((fVar304 - fVar159) * 0.33333334 + fVar270) * fVar70;
  fStack_370 = ((fVar231 - fVar324) * 0.33333334 + fVar239) * fVar199 +
               ((fVar310 - fVar171) * 0.33333334 + fVar283) * fVar70;
  fStack_36c = ((fVar269 - fVar326) * 0.33333334 + fVar244) * fVar199 +
               ((fVar323 - fVar172) * 0.33333334 + fVar286) * fVar70;
  local_398 = (fVar248 - (fVar200 - fVar325) * 0.33333334) * fVar199 +
              (fVar149 - (fVar148 - fVar334) * 0.33333334) * fVar70;
  fStack_394 = (fVar262 - (fVar203 - fVar336) * 0.33333334) * fVar199 +
               (fVar158 - (fVar107 - fVar232) * 0.33333334) * fVar70;
  fStack_390 = (fVar265 - (fVar205 - fVar237) * 0.33333334) * fVar199 +
               (fVar170 - (fVar108 - fVar328) * 0.33333334) * fVar70;
  fStack_38c = (fVar267 - (fVar219 - fVar243) * 0.33333334) * fVar199 +
               (fVar307 - (fVar109 - fVar238) * 0.33333334) * fVar70;
  local_388 = fVar248 * fVar199 + fVar149 * fVar70;
  fStack_384 = fVar262 * fVar199 + fVar158 * fVar70;
  fStack_380 = fVar265 * fVar199 + fVar170 * fVar70;
  fStack_37c = fVar267 * fVar199 + fVar307 * fVar70;
  local_358 = fVar329 * fVar199 + fVar198 * fVar70;
  fStack_354 = fVar335 * fVar199 + fVar284 * fVar70;
  fStack_350 = fVar337 * fVar199 + fVar301 * fVar70;
  fStack_34c = fVar339 * fVar199 + fVar321 * fVar70;
  local_3b8 = ((fVar311 + fVar261) * 0.33333334 + fVar329) * fVar199 +
              ((fVar157 + fVar289) * 0.33333334 + fVar198) * fVar70;
  fStack_3b4 = ((fVar322 + fVar327) * 0.33333334 + fVar335) * fVar199 +
               ((fVar159 + fVar304) * 0.33333334 + fVar284) * fVar70;
  fStack_3b0 = ((fVar324 + fVar231) * 0.33333334 + fVar337) * fVar199 +
               ((fVar171 + fVar310) * 0.33333334 + fVar301) * fVar70;
  fStack_3ac = ((fVar326 + fVar269) * 0.33333334 + fVar339) * fVar199 +
               ((fVar172 + fVar323) * 0.33333334 + fVar321) * fVar70;
  local_3c8 = (fVar264 - (fVar325 + fVar200) * 0.33333334) * fVar199 +
              (fVar133 - (fVar334 + fVar148) * 0.33333334) * fVar70;
  fStack_3c4 = (fVar220 - (fVar336 + fVar203) * 0.33333334) * fVar199 +
               (fVar134 - (fVar232 + fVar107) * 0.33333334) * fVar70;
  fStack_3c0 = (fVar236 - (fVar237 + fVar205) * 0.33333334) * fVar199 +
               (fVar135 - (fVar328 + fVar108) * 0.33333334) * fVar70;
  fStack_3bc = (fVar281 - (fVar243 + fVar219) * 0.33333334) * fVar199 +
               (fVar147 - (fVar238 + fVar109) * 0.33333334) * fVar70;
  local_208 = fVar199 * fVar264 + fVar70 * fVar133;
  fStack_204 = fVar199 * fVar220 + fVar70 * fVar134;
  fStack_200 = fVar199 * fVar236 + fVar70 * fVar135;
  fStack_1fc = fVar199 * fVar281 + fVar70 * fVar147;
  fVar148 = (ray->org).field_0.m128[0];
  fVar70 = (ray->org).field_0.m128[1];
  fVar107 = (ray->org).field_0.m128[2];
  fVar108 = (pre->ray_space).vx.field_0.m128[0];
  fVar109 = (pre->ray_space).vx.field_0.m128[1];
  fVar133 = (pre->ray_space).vy.field_0.m128[0];
  fVar134 = (pre->ray_space).vy.field_0.m128[1];
  fVar135 = (pre->ray_space).vz.field_0.m128[0];
  fVar147 = (pre->ray_space).vz.field_0.m128[1];
  fVar158 = (local_368 - fVar148) * fVar108 +
            (fStack_364 - fVar70) * fVar133 + (fStack_360 - fVar107) * fVar135;
  fVar159 = (local_368 - fVar148) * fVar109 +
            (fStack_364 - fVar70) * fVar134 + (fStack_360 - fVar107) * fVar147;
  local_2b8 = CONCAT44(fVar159,fVar158);
  fVar149 = (local_378 - fVar148) * fVar108 +
            (fStack_374 - fVar70) * fVar133 + (fStack_370 - fVar107) * fVar135;
  fVar157 = (local_378 - fVar148) * fVar109 +
            (fStack_374 - fVar70) * fVar134 + (fStack_370 - fVar107) * fVar147;
  local_2c8 = CONCAT44(fVar157,fVar149);
  fVar199 = (local_398 - fVar148) * fVar108 +
            (fStack_394 - fVar70) * fVar133 + (fStack_390 - fVar107) * fVar135;
  fVar200 = (local_398 - fVar148) * fVar109 +
            (fStack_394 - fVar70) * fVar134 + (fStack_390 - fVar107) * fVar147;
  local_2d8 = CONCAT44(fVar200,fVar199);
  fVar172 = (local_388 - fVar148) * fVar108 +
            (fStack_384 - fVar70) * fVar133 + (fStack_380 - fVar107) * fVar135;
  fVar198 = (local_388 - fVar148) * fVar109 +
            (fStack_384 - fVar70) * fVar134 + (fStack_380 - fVar107) * fVar147;
  local_2e8 = CONCAT44(fVar198,fVar172);
  local_2f8 = (local_358 - fVar148) * fVar108 +
              (fStack_354 - fVar70) * fVar133 + (fStack_350 - fVar107) * fVar135;
  fStack_2f4 = (local_358 - fVar148) * fVar109 +
               (fStack_354 - fVar70) * fVar134 + (fStack_350 - fVar107) * fVar147;
  fVar170 = (local_3b8 - fVar148) * fVar108 +
            (fStack_3b4 - fVar70) * fVar133 + (fStack_3b0 - fVar107) * fVar135;
  fVar171 = (local_3b8 - fVar148) * fVar109 +
            (fStack_3b4 - fVar70) * fVar134 + (fStack_3b0 - fVar107) * fVar147;
  uStack_290 = CONCAT44(fVar171,fVar170);
  local_318 = (local_3c8 - fVar148) * fVar108 +
              (fStack_3c4 - fVar70) * fVar133 + (fStack_3c0 - fVar107) * fVar135;
  fStack_314 = (local_3c8 - fVar148) * fVar109 +
               (fStack_3c4 - fVar70) * fVar134 + (fStack_3c0 - fVar107) * fVar147;
  fVar108 = (local_208 - fVar148) * fVar108 +
            (fStack_204 - fVar70) * fVar133 + (fStack_200 - fVar107) * fVar135;
  fVar148 = (local_208 - fVar148) * fVar109 +
            (fStack_204 - fVar70) * fVar134 + (fStack_200 - fVar107) * fVar147;
  local_328 = CONCAT44(fVar148,fVar108);
  auVar317._8_8_ = uStack_290;
  auVar317._0_8_ = local_2c8;
  auVar222._8_8_ = local_328;
  auVar222._0_8_ = local_2e8;
  auVar91._8_4_ = local_2f8;
  auVar91._0_8_ = local_2b8;
  auVar91._12_4_ = fStack_2f4;
  auVar71 = minps(auVar91,auVar317);
  auVar121._8_4_ = local_318;
  auVar121._0_8_ = local_2d8;
  auVar121._12_4_ = fStack_314;
  auVar137 = minps(auVar121,auVar222);
  auVar71 = minps(auVar71,auVar137);
  auVar122._4_4_ = fVar159;
  auVar122._0_4_ = fVar158;
  auVar122._8_4_ = local_2f8;
  auVar122._12_4_ = fStack_2f4;
  auVar137 = maxps(auVar122,auVar317);
  auVar138._4_4_ = fVar200;
  auVar138._0_4_ = fVar199;
  auVar138._8_4_ = local_318;
  auVar138._12_4_ = fStack_314;
  auVar139 = maxps(auVar138,auVar222);
  auVar123 = maxps(auVar137,auVar139);
  auVar22._4_8_ = auVar139._8_8_;
  auVar22._0_4_ = auVar71._4_4_;
  auVar140._0_8_ = auVar22._0_8_ << 0x20;
  auVar140._8_4_ = auVar71._8_4_;
  auVar140._12_4_ = auVar71._12_4_;
  auVar141._8_8_ = auVar71._8_8_;
  auVar141._0_8_ = auVar140._8_8_;
  auVar137 = minps(auVar71,auVar141);
  auVar23._4_8_ = auVar71._8_8_;
  auVar23._0_4_ = auVar123._4_4_;
  auVar142._0_8_ = auVar23._0_8_ << 0x20;
  auVar142._8_4_ = auVar123._8_4_;
  auVar142._12_4_ = auVar123._12_4_;
  auVar143._8_8_ = auVar123._8_8_;
  auVar143._0_8_ = auVar142._8_8_;
  auVar71 = maxps(auVar123,auVar143);
  auVar92._0_8_ = auVar137._0_8_ & 0x7fffffff7fffffff;
  auVar92._8_4_ = auVar137._8_4_ & 0x7fffffff;
  auVar92._12_4_ = auVar137._12_4_ & 0x7fffffff;
  auVar124._0_8_ = auVar71._0_8_ & 0x7fffffff7fffffff;
  auVar124._8_4_ = auVar71._8_4_ & 0x7fffffff;
  auVar124._12_4_ = auVar71._12_4_ & 0x7fffffff;
  auVar71 = maxps(auVar92,auVar124);
  fStack_284 = auVar71._4_4_;
  local_288 = fStack_284;
  if (fStack_284 <= auVar71._0_4_) {
    local_288 = auVar71._0_4_;
  }
  local_288 = local_288 * 9.536743e-07;
  register0x00001488 = local_2b8;
  register0x00001388 = local_2c8;
  register0x000015c8 = local_2d8;
  register0x00001588 = local_2e8;
  register0x00001288 = uStack_290;
  local_308 = uStack_290;
  register0x00001348 = local_328;
  local_138 = local_288;
  fStack_134 = local_288;
  fStack_130 = local_288;
  fStack_12c = local_288;
  local_148 = -local_288;
  fStack_144 = -local_288;
  fStack_140 = -local_288;
  fStack_13c = -local_288;
  afStack_1e8[0] = local_2f8;
  afStack_1e8[1] = fStack_2f4;
  local_88 = fVar149 - fVar158;
  fStack_84 = fVar157 - fVar159;
  fStack_80 = fVar170 - local_2f8;
  fStack_7c = fVar171 - fStack_2f4;
  local_98 = fVar199 - fVar149;
  fStack_94 = fVar200 - fVar157;
  fStack_90 = local_318 - fVar170;
  fStack_8c = fStack_314 - fVar171;
  fStack_294 = fStack_314;
  local_298 = local_318;
  local_a8 = fVar172 - fVar199;
  fStack_a4 = fVar198 - fVar200;
  fStack_a0 = fVar108 - local_318;
  fStack_9c = fVar148 - fStack_314;
  local_178 = local_358 - local_368;
  fStack_174 = fStack_354 - fStack_364;
  fStack_170 = fStack_350 - fStack_360;
  fStack_16c = fStack_34c - fStack_35c;
  local_188 = local_3b8 - local_378;
  fStack_184 = fStack_3b4 - fStack_374;
  fStack_180 = fStack_3b0 - fStack_370;
  fStack_17c = fStack_3ac - fStack_36c;
  local_198 = local_3c8 - local_398;
  fStack_194 = fStack_3c4 - fStack_394;
  fStack_190 = fStack_3c0 - fStack_390;
  fStack_18c = fStack_3bc - fStack_38c;
  local_1a8 = local_208 - local_388;
  fStack_1a4 = fStack_204 - fStack_384;
  fStack_1a0 = fStack_200 - fStack_380;
  fStack_19c = fStack_1fc - fStack_37c;
  uVar56 = 0;
  uVar60 = 0;
  fVar109 = 0.0;
  fVar133 = 1.0;
  fVar70 = 0.0;
  fVar107 = 1.0;
  fStack_310 = local_318;
  fStack_30c = fStack_314;
  fStack_2f0 = local_2f8;
  fStack_2ec = fStack_2f4;
  local_2a8 = local_2d8;
  fStack_280 = fStack_284;
  fStack_27c = fStack_284;
  local_278 = (ulong)uVar65;
  local_1f8 = local_2b8;
LAB_00b30cbf:
  do {
    fVar134 = 1.0 - fVar70;
    fVar135 = 1.0 - fVar70;
    fVar147 = 1.0 - fVar107;
    fVar149 = 1.0 - fVar107;
    fVar219 = local_2b8._0_4_ * fVar134 + local_2f8 * fVar70;
    fVar231 = local_2b8._4_4_ * fVar135 + fStack_2f4 * fVar70;
    fVar236 = local_2b8._8_4_ * fVar147 + fStack_2f0 * fVar107;
    fVar284 = local_2b8._12_4_ * fVar149 + fStack_2ec * fVar107;
    fVar159 = local_2c8._0_4_ * fVar134 + local_308._0_4_ * fVar70;
    fVar264 = local_2c8._4_4_ * fVar135 + local_308._4_4_ * fVar70;
    fVar327 = local_2c8._8_4_ * fVar147 + local_308._8_4_ * fVar107;
    fVar220 = local_2c8._12_4_ * fVar149 + local_308._12_4_ * fVar107;
    fVar323 = local_2d8._0_4_ * fVar134 + local_318 * fVar70;
    fVar325 = local_2d8._4_4_ * fVar135 + fStack_314 * fVar70;
    fVar328 = local_2d8._8_4_ * fVar147 + fStack_310 * fVar107;
    fVar334 = local_2d8._12_4_ * fVar149 + fStack_30c * fVar107;
    fVar269 = fVar134 * local_2e8._0_4_ + fVar70 * local_328._0_4_;
    fVar281 = fVar135 * local_2e8._4_4_ + fVar70 * local_328._4_4_;
    fVar289 = fVar147 * local_2e8._8_4_ + fVar107 * local_328._8_4_;
    fVar301 = fVar149 * local_2e8._12_4_ + fVar107 * local_328._12_4_;
    fVar304 = (fVar133 - fVar109) * 0.11111111;
    local_3f8 = CONCAT44(fVar133,fVar109);
    fVar307 = (fVar133 - fVar109) * 0.0 + fVar109;
    fVar310 = (fVar133 - fVar109) * 0.33333334 + fVar109;
    fVar321 = (fVar133 - fVar109) * 0.6666667 + fVar109;
    fVar109 = (fVar133 - fVar109) * 1.0 + fVar109;
    fVar133 = 1.0 - fVar307;
    fVar134 = 1.0 - fVar310;
    fVar135 = 1.0 - fVar321;
    fVar158 = 1.0 - fVar109;
    fVar170 = fVar159 * fVar133 + fVar323 * fVar307;
    fVar171 = fVar159 * fVar134 + fVar323 * fVar310;
    fVar199 = fVar159 * fVar135 + fVar323 * fVar321;
    fVar200 = fVar159 * fVar158 + fVar323 * fVar109;
    fVar203 = fVar264 * fVar133 + fVar325 * fVar307;
    fVar204 = fVar264 * fVar134 + fVar325 * fVar310;
    fVar205 = fVar264 * fVar135 + fVar325 * fVar321;
    fVar218 = fVar264 * fVar158 + fVar325 * fVar109;
    fVar147 = (fVar219 * fVar133 + fVar159 * fVar307) * fVar133 + fVar307 * fVar170;
    fVar149 = (fVar219 * fVar134 + fVar159 * fVar310) * fVar134 + fVar310 * fVar171;
    fVar157 = (fVar219 * fVar135 + fVar159 * fVar321) * fVar135 + fVar321 * fVar199;
    fVar159 = (fVar219 * fVar158 + fVar159 * fVar109) * fVar158 + fVar109 * fVar200;
    fVar219 = (fVar231 * fVar133 + fVar264 * fVar307) * fVar133 + fVar307 * fVar203;
    fVar247 = (fVar231 * fVar134 + fVar264 * fVar310) * fVar134 + fVar310 * fVar204;
    fVar261 = (fVar231 * fVar135 + fVar264 * fVar321) * fVar135 + fVar321 * fVar205;
    fVar264 = (fVar231 * fVar158 + fVar264 * fVar109) * fVar158 + fVar109 * fVar218;
    fVar170 = fVar170 * fVar133 + (fVar323 * fVar133 + fVar269 * fVar307) * fVar307;
    fVar171 = fVar171 * fVar134 + (fVar323 * fVar134 + fVar269 * fVar310) * fVar310;
    fVar199 = fVar199 * fVar135 + (fVar323 * fVar135 + fVar269 * fVar321) * fVar321;
    fVar200 = fVar200 * fVar158 + (fVar323 * fVar158 + fVar269 * fVar109) * fVar109;
    fVar203 = fVar203 * fVar133 + (fVar325 * fVar133 + fVar281 * fVar307) * fVar307;
    fVar204 = fVar204 * fVar134 + (fVar325 * fVar134 + fVar281 * fVar310) * fVar310;
    fVar205 = fVar205 * fVar135 + (fVar325 * fVar135 + fVar281 * fVar321) * fVar321;
    fVar218 = fVar218 * fVar158 + (fVar325 * fVar158 + fVar281 * fVar109) * fVar109;
    local_238 = fVar133 * fVar147 + fVar307 * fVar170;
    fStack_234 = fVar134 * fVar149 + fVar310 * fVar171;
    fStack_230 = fVar135 * fVar157 + fVar321 * fVar199;
    fStack_22c = fVar158 * fVar159 + fVar109 * fVar200;
    local_128 = fVar133 * fVar219 + fVar307 * fVar203;
    fStack_124 = fVar134 * fVar247 + fVar310 * fVar204;
    fStack_120 = fVar135 * fVar261 + fVar321 * fVar205;
    fStack_11c = fVar158 * fVar264 + fVar109 * fVar218;
    fVar149 = (fVar171 - fVar149) * 3.0 * fVar304;
    fVar157 = (fVar199 - fVar157) * 3.0 * fVar304;
    fVar159 = (fVar200 - fVar159) * 3.0 * fVar304;
    fVar171 = (fVar204 - fVar247) * 3.0 * fVar304;
    fVar199 = (fVar205 - fVar261) * 3.0 * fVar304;
    fVar200 = (fVar218 - fVar264) * 3.0 * fVar304;
    local_3a8._4_4_ = fStack_230;
    local_3a8._0_4_ = fStack_234;
    local_3a8._8_4_ = fStack_22c;
    local_3a8._12_4_ = 0;
    local_c8._4_4_ = fStack_120;
    local_c8._0_4_ = fStack_124;
    local_218 = local_238 + (fVar170 - fVar147) * 3.0 * fVar304;
    fStack_214 = fStack_234 + fVar149;
    fStack_210 = fStack_230 + fVar157;
    fStack_20c = fStack_22c + fVar159;
    local_338._0_4_ = local_128 + (fVar203 - fVar219) * 3.0 * fVar304;
    local_338._4_4_ = fStack_124 + fVar171;
    fStack_330 = fStack_120 + fVar199;
    fStack_32c = fStack_11c + fVar200;
    local_228._0_4_ = fStack_234 - fVar149;
    local_228._4_4_ = fStack_230 - fVar157;
    local_228._8_4_ = fStack_22c - fVar159;
    local_228._12_4_ = 0;
    local_408._0_4_ = fStack_124 - fVar171;
    local_408._4_4_ = fStack_120 - fVar199;
    fStack_400 = fStack_11c - fVar200;
    fStack_3fc = 0.0;
    fVar147 = fVar327 * fVar133 + fVar328 * fVar307;
    fVar149 = fVar327 * fVar134 + fVar328 * fVar310;
    fVar157 = fVar327 * fVar135 + fVar328 * fVar321;
    fVar159 = fVar327 * fVar158 + fVar328 * fVar109;
    fVar170 = fVar220 * fVar133 + fVar334 * fVar307;
    fVar171 = fVar220 * fVar134 + fVar334 * fVar310;
    fVar199 = fVar220 * fVar135 + fVar334 * fVar321;
    fVar231 = fVar220 * fVar158 + fVar334 * fVar109;
    fVar200 = (fVar236 * fVar133 + fVar327 * fVar307) * fVar133 + fVar307 * fVar147;
    fVar203 = (fVar236 * fVar134 + fVar327 * fVar310) * fVar134 + fVar310 * fVar149;
    fVar204 = (fVar236 * fVar135 + fVar327 * fVar321) * fVar135 + fVar321 * fVar157;
    fVar205 = (fVar236 * fVar158 + fVar327 * fVar109) * fVar158 + fVar109 * fVar159;
    fVar236 = (fVar284 * fVar133 + fVar220 * fVar307) * fVar133 + fVar307 * fVar170;
    fVar269 = (fVar284 * fVar134 + fVar220 * fVar310) * fVar134 + fVar310 * fVar171;
    fVar281 = (fVar284 * fVar135 + fVar220 * fVar321) * fVar135 + fVar321 * fVar199;
    fVar284 = (fVar284 * fVar158 + fVar220 * fVar109) * fVar158 + fVar109 * fVar231;
    fVar218 = fVar147 * fVar133 + (fVar328 * fVar133 + fVar289 * fVar307) * fVar307;
    fVar219 = fVar149 * fVar134 + (fVar328 * fVar134 + fVar289 * fVar310) * fVar310;
    fVar247 = fVar157 * fVar135 + (fVar328 * fVar135 + fVar289 * fVar321) * fVar321;
    fVar261 = fVar159 * fVar158 + (fVar328 * fVar158 + fVar289 * fVar109) * fVar109;
    fVar264 = fVar170 * fVar133 + (fVar334 * fVar133 + fVar301 * fVar307) * fVar307;
    fVar327 = fVar171 * fVar134 + (fVar334 * fVar134 + fVar301 * fVar310) * fVar310;
    fVar220 = fVar199 * fVar135 + (fVar334 * fVar135 + fVar301 * fVar321) * fVar321;
    fVar231 = fVar231 * fVar158 + (fVar334 * fVar158 + fVar301 * fVar109) * fVar109;
    fVar159 = fVar133 * fVar200 + fVar307 * fVar218;
    fVar170 = fVar134 * fVar203 + fVar310 * fVar219;
    fVar171 = fVar135 * fVar204 + fVar321 * fVar247;
    fVar199 = fVar158 * fVar205 + fVar109 * fVar261;
    fVar147 = fVar133 * fVar236 + fVar307 * fVar264;
    fVar149 = fVar134 * fVar269 + fVar310 * fVar327;
    fVar157 = fVar135 * fVar281 + fVar321 * fVar220;
    fVar158 = fVar158 * fVar284 + fVar109 * fVar231;
    fVar109 = (fVar219 - fVar203) * 3.0 * fVar304;
    fVar133 = (fVar247 - fVar204) * 3.0 * fVar304;
    fVar134 = (fVar261 - fVar205) * 3.0 * fVar304;
    fVar135 = (fVar327 - fVar269) * 3.0 * fVar304;
    fVar203 = (fVar220 - fVar281) * 3.0 * fVar304;
    fVar204 = (fVar231 - fVar284) * 3.0 * fVar304;
    local_d8._4_4_ = fVar171;
    local_d8._0_4_ = fVar170;
    local_d8._8_4_ = fVar199;
    local_d8._12_4_ = 0;
    local_f8._4_4_ = fVar157;
    local_f8._0_4_ = fVar149;
    local_f8._8_4_ = fVar158;
    local_f8._12_4_ = 0;
    local_118 = fVar159 + (fVar218 - fVar200) * 3.0 * fVar304;
    fStack_114 = fVar170 + fVar109;
    fStack_110 = fVar171 + fVar133;
    fStack_10c = fVar199 + fVar134;
    local_e8 = fVar147 + (fVar264 - fVar236) * 3.0 * fVar304;
    fStack_e4 = fVar149 + fVar135;
    fStack_e0 = fVar157 + fVar203;
    fStack_dc = fVar158 + fVar204;
    local_b8._0_4_ = fVar170 - fVar109;
    local_b8._4_4_ = fVar171 - fVar133;
    local_b8._8_4_ = fVar199 - fVar134;
    local_b8._12_4_ = 0;
    local_108._0_4_ = fVar149 - fVar135;
    local_108._4_4_ = fVar157 - fVar203;
    local_108._8_4_ = fVar158 - fVar204;
    local_108._12_4_ = 0;
    fVar109 = (fVar170 - fStack_234) + (fVar159 - local_238);
    fVar133 = (fVar171 - fStack_230) + (fVar170 - fStack_234);
    fVar134 = (fVar199 - fStack_22c) + (fVar171 - fStack_230);
    fVar135 = (fVar199 - fStack_22c) + 0.0;
    local_c8._8_4_ = fStack_11c;
    local_c8._12_4_ = 0;
    fVar200 = (fVar149 - fStack_124) + (fVar147 - local_128);
    fVar203 = (fVar157 - fStack_120) + (fVar149 - fStack_124);
    fVar204 = (fVar158 - fStack_11c) + (fVar157 - fStack_120);
    fVar205 = (fVar158 - fStack_11c) + 0.0;
    auVar211._0_8_ =
         CONCAT44(fStack_124 * fVar133 - fStack_234 * fVar203,
                  local_128 * fVar109 - local_238 * fVar200);
    auVar211._8_4_ = fStack_120 * fVar134 - fStack_230 * fVar204;
    auVar211._12_4_ = fStack_11c * fVar135 - fStack_22c * fVar205;
    auVar160._0_4_ = (float)local_338._0_4_ * fVar109 - local_218 * fVar200;
    auVar160._4_4_ = (float)local_338._4_4_ * fVar133 - fStack_214 * fVar203;
    auVar160._8_4_ = fStack_330 * fVar134 - fStack_210 * fVar204;
    auVar160._12_4_ = fStack_32c * fVar135 - fStack_20c * fVar205;
    auVar189._0_8_ =
         CONCAT44((float)local_408._4_4_ * fVar133 - fVar203 * local_228._4_4_,
                  (float)local_408._0_4_ * fVar109 - fVar200 * local_228._0_4_);
    auVar189._8_4_ = fStack_400 * fVar134 - fVar204 * local_228._8_4_;
    auVar189._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
    auVar318._0_4_ = fVar109 * fStack_124 - fVar200 * fStack_234;
    auVar318._4_4_ = fVar133 * fStack_120 - fVar203 * fStack_230;
    auVar318._8_4_ = fVar134 * fStack_11c - fVar204 * fStack_22c;
    auVar318._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
    auVar254._0_8_ =
         CONCAT44(fVar149 * fVar133 - fVar170 * fVar203,fVar147 * fVar109 - fVar159 * fVar200);
    auVar254._8_4_ = fVar157 * fVar134 - fVar171 * fVar204;
    auVar254._12_4_ = fVar158 * fVar135 - fVar199 * fVar205;
    auVar333._0_4_ = local_e8 * fVar109 - local_118 * fVar200;
    auVar333._4_4_ = fStack_e4 * fVar133 - fStack_114 * fVar203;
    auVar333._8_4_ = fStack_e0 * fVar134 - fStack_110 * fVar204;
    auVar333._12_4_ = fStack_dc * fVar135 - fStack_10c * fVar205;
    auVar223._0_8_ =
         CONCAT44(local_108._4_4_ * fVar133 - fVar203 * local_b8._4_4_,
                  local_108._0_4_ * fVar109 - fVar200 * local_b8._0_4_);
    auVar223._8_4_ = local_108._8_4_ * fVar134 - fVar204 * local_b8._8_4_;
    auVar223._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
    auVar93._0_4_ = fVar109 * fVar149 - fVar200 * fVar170;
    auVar93._4_4_ = fVar133 * fVar157 - fVar203 * fVar171;
    auVar93._8_4_ = fVar134 * fVar158 - fVar204 * fVar199;
    auVar93._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
    auVar125._8_4_ = auVar211._8_4_;
    auVar125._0_8_ = auVar211._0_8_;
    auVar125._12_4_ = auVar211._12_4_;
    auVar71 = minps(auVar125,auVar160);
    auVar123 = maxps(auVar211,auVar160);
    auVar161._8_4_ = auVar189._8_4_;
    auVar161._0_8_ = auVar189._0_8_;
    auVar161._12_4_ = auVar189._12_4_;
    auVar137 = minps(auVar161,auVar318);
    auVar71 = minps(auVar71,auVar137);
    auVar137 = maxps(auVar189,auVar318);
    auVar139 = maxps(auVar123,auVar137);
    auVar162._8_4_ = auVar254._8_4_;
    auVar162._0_8_ = auVar254._0_8_;
    auVar162._12_4_ = auVar254._12_4_;
    auVar137 = minps(auVar162,auVar333);
    auVar255 = maxps(auVar254,auVar333);
    auVar190._8_4_ = auVar223._8_4_;
    auVar190._0_8_ = auVar223._0_8_;
    auVar190._12_4_ = auVar223._12_4_;
    auVar123 = minps(auVar190,auVar93);
    auVar137 = minps(auVar137,auVar123);
    auVar71 = minps(auVar71,auVar137);
    auVar137 = maxps(auVar223,auVar93);
    auVar137 = maxps(auVar255,auVar137);
    auVar137 = maxps(auVar139,auVar137);
    auVar212._0_4_ =
         -(uint)(local_148 <= auVar137._0_4_ && auVar71._0_4_ <= local_138) & local_158._0_4_;
    auVar212._4_4_ =
         -(uint)(fStack_144 <= auVar137._4_4_ && auVar71._4_4_ <= fStack_134) & local_158._4_4_;
    auVar212._8_4_ =
         -(uint)(fStack_140 <= auVar137._8_4_ && auVar71._8_4_ <= fStack_130) & local_158._8_4_;
    auVar212._12_4_ =
         -(uint)(fStack_13c <= auVar137._12_4_ && auVar71._12_4_ <= fStack_12c) & local_158._12_4_;
    uVar65 = movmskps((int)uVar57,auVar212);
    uVar57 = (ulong)uVar65;
    if (uVar65 != 0) {
      fVar109 = (fVar170 - fVar159) + (fStack_234 - local_238);
      fVar133 = (fVar171 - fVar170) + (fStack_230 - fStack_234);
      fVar134 = (fVar199 - fVar171) + (fStack_22c - fStack_230);
      fVar135 = (0.0 - fVar199) + (0.0 - fStack_22c);
      fVar200 = (fVar149 - fVar147) + (fStack_124 - local_128);
      fVar203 = (fVar157 - fVar149) + (fStack_120 - fStack_124);
      fVar204 = (fVar158 - fVar157) + (fStack_11c - fStack_120);
      fVar205 = (0.0 - fVar158) + (0.0 - fStack_11c);
      auVar340._0_8_ =
           CONCAT44(fStack_124 * fVar133 - fStack_234 * fVar203,
                    local_128 * fVar109 - local_238 * fVar200);
      auVar340._8_4_ = fStack_120 * fVar134 - fStack_230 * fVar204;
      auVar340._12_4_ = fStack_11c * fVar135 - fStack_22c * fVar205;
      auVar163._0_4_ = (float)local_338._0_4_ * fVar109 - local_218 * fVar200;
      auVar163._4_4_ = (float)local_338._4_4_ * fVar133 - fStack_214 * fVar203;
      auVar163._8_4_ = fStack_330 * fVar134 - fStack_210 * fVar204;
      auVar163._12_4_ = fStack_32c * fVar135 - fStack_20c * fVar205;
      auVar224._0_8_ =
           CONCAT44((float)local_408._4_4_ * fVar133 - local_228._4_4_ * fVar203,
                    (float)local_408._0_4_ * fVar109 - local_228._0_4_ * fVar200);
      auVar224._8_4_ = fStack_400 * fVar134 - local_228._8_4_ * fVar204;
      auVar224._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
      auVar191._0_4_ = fStack_124 * fVar109 - fStack_234 * fVar200;
      auVar191._4_4_ = fStack_120 * fVar133 - fStack_230 * fVar203;
      auVar191._8_4_ = fStack_11c * fVar134 - fStack_22c * fVar204;
      auVar191._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
      auVar144._0_8_ =
           CONCAT44(fVar149 * fVar133 - fVar170 * fVar203,fVar147 * fVar109 - fVar159 * fVar200);
      auVar144._8_4_ = fVar157 * fVar134 - fVar171 * fVar204;
      auVar144._12_4_ = fVar158 * fVar135 - fVar199 * fVar205;
      auVar276._0_4_ = local_e8 * fVar109 - local_118 * fVar200;
      auVar276._4_4_ = fStack_e4 * fVar133 - fStack_114 * fVar203;
      auVar276._8_4_ = fStack_e0 * fVar134 - fStack_110 * fVar204;
      auVar276._12_4_ = fStack_dc * fVar135 - fStack_10c * fVar205;
      auVar319._0_8_ =
           CONCAT44(local_108._4_4_ * fVar133 - local_b8._4_4_ * fVar203,
                    local_108._0_4_ * fVar109 - local_b8._0_4_ * fVar200);
      auVar319._8_4_ = local_108._8_4_ * fVar134 - local_b8._8_4_ * fVar204;
      auVar319._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
      auVar94._0_4_ = fVar109 * fVar149 - fVar200 * fVar170;
      auVar94._4_4_ = fVar133 * fVar157 - fVar203 * fVar171;
      auVar94._8_4_ = fVar134 * fVar158 - fVar204 * fVar199;
      auVar94._12_4_ = fVar135 * 0.0 - fVar205 * 0.0;
      auVar126._8_4_ = auVar340._8_4_;
      auVar126._0_8_ = auVar340._0_8_;
      auVar126._12_4_ = auVar340._12_4_;
      auVar71 = minps(auVar126,auVar163);
      auVar123 = maxps(auVar340,auVar163);
      auVar164._8_4_ = auVar224._8_4_;
      auVar164._0_8_ = auVar224._0_8_;
      auVar164._12_4_ = auVar224._12_4_;
      auVar137 = minps(auVar164,auVar191);
      auVar71 = minps(auVar71,auVar137);
      auVar137 = maxps(auVar224,auVar191);
      auVar255 = maxps(auVar123,auVar137);
      auVar165._8_4_ = auVar144._8_4_;
      auVar165._0_8_ = auVar144._0_8_;
      auVar165._12_4_ = auVar144._12_4_;
      auVar123 = minps(auVar165,auVar276);
      auVar137 = maxps(auVar144,auVar276);
      auVar192._8_4_ = auVar319._8_4_;
      auVar192._0_8_ = auVar319._0_8_;
      auVar192._12_4_ = auVar319._12_4_;
      auVar139 = minps(auVar192,auVar94);
      auVar123 = minps(auVar123,auVar139);
      auVar71 = minps(auVar71,auVar123);
      auVar123 = maxps(auVar319,auVar94);
      auVar137 = maxps(auVar137,auVar123);
      auVar137 = maxps(auVar255,auVar137);
      auVar341._0_4_ =
           -(uint)(local_148 <= auVar137._0_4_ && auVar71._0_4_ <= local_138) & auVar212._0_4_;
      auVar341._4_4_ =
           -(uint)(fStack_144 <= auVar137._4_4_ && auVar71._4_4_ <= fStack_134) & auVar212._4_4_;
      auVar341._8_4_ =
           -(uint)(fStack_140 <= auVar137._8_4_ && auVar71._8_4_ <= fStack_130) & auVar212._8_4_;
      auVar341._12_4_ =
           -(uint)(fStack_13c <= auVar137._12_4_ && auVar71._12_4_ <= fStack_12c) & auVar212._12_4_;
      uVar65 = movmskps(uVar65,auVar341);
      uVar57 = (ulong)uVar65;
      auVar333 = local_f8;
      if (uVar65 != 0) {
        uVar57 = (ulong)(byte)uVar65;
        afStack_1e8[uVar60] = (float)(uVar65 & 0xff);
        *(undefined8 *)(afStack_78 + uVar60 * 2) = local_3f8;
        *(ulong *)(afStack_58 + uVar60 * 2) = CONCAT44(fVar107,fVar70);
        uVar60 = (ulong)((int)uVar60 + 1);
      }
    }
LAB_00b3131f:
    auVar71 = _local_408;
    if ((int)uVar60 == 0) {
      if ((uVar56 & 1) != 0) goto LAB_00b3242a;
      fVar148 = ray->tfar;
      auVar132._4_4_ = -(uint)(fStack_164 <= fVar148);
      auVar132._0_4_ = -(uint)(local_168 <= fVar148);
      auVar132._8_4_ = -(uint)(fStack_160 <= fVar148);
      auVar132._12_4_ = -(uint)(fStack_15c <= fVar148);
      uVar65 = movmskps((int)uVar57,auVar132);
      uVar63 = uVar63 & uVar63 + 0xf & uVar65;
      if (uVar63 != 0) goto LAB_00b2ff98;
      goto LAB_00b3242a;
    }
    uVar65 = (int)uVar60 - 1;
    uVar57 = (ulong)uVar65;
    fVar109 = afStack_1e8[uVar57];
    fVar70 = afStack_58[uVar57 * 2];
    fVar107 = afStack_58[uVar57 * 2 + 1];
    uVar5 = 0;
    if (fVar109 != 0.0) {
      for (; ((uint)fVar109 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    fVar109 = (float)((int)fVar109 - 1U & (uint)fVar109);
    afStack_1e8[uVar57] = fVar109;
    if (fVar109 == 0.0) {
      uVar60 = (ulong)uVar65;
    }
    fVar133 = (float)(uVar5 + 1) * 0.33333334;
    fVar134 = afStack_78[uVar57 * 2];
    fVar135 = afStack_78[uVar57 * 2 + 1];
    fVar109 = fVar134 * (1.0 - (float)uVar5 * 0.33333334) + fVar135 * (float)uVar5 * 0.33333334;
    fVar133 = fVar134 * (1.0 - fVar133) + fVar135 * fVar133;
    fVar147 = fVar134 * 0.0 + fVar135 * 0.0;
    fVar135 = fVar134 * 0.0 + fVar135 * 0.0;
    fVar134 = fVar133 - fVar109;
    if (fVar134 < 0.16666667) {
      fVar203 = 1.0 - fVar70;
      fVar204 = 1.0 - fVar70;
      fVar219 = 1.0 - fVar107;
      fVar247 = 1.0 - fVar107;
      fVar170 = (float)local_2b8._0_4_ * fVar203 + local_2f8 * fVar70;
      fVar199 = (float)local_2b8._4_4_ * fVar204 + fStack_2f4 * fVar70;
      fVar149 = fStack_2b0 * fVar219 + fStack_2f0 * fVar107;
      fVar157 = fStack_2ac * fVar247 + fStack_2ec * fVar107;
      fVar158 = (float)local_2c8._0_4_ * fVar203 + (float)local_308._0_4_ * fVar70;
      fVar159 = (float)local_2c8._4_4_ * fVar204 + (float)local_308._4_4_ * fVar70;
      fVar171 = fStack_2c0 * fVar219 + fStack_300 * fVar107;
      fVar200 = fStack_2bc * fVar247 + fStack_2fc * fVar107;
      fVar327 = (float)local_2d8._0_4_ * fVar203 + local_318 * fVar70;
      fVar231 = (float)local_2d8._4_4_ * fVar204 + fStack_314 * fVar70;
      fVar269 = fStack_2d0 * fVar219 + fStack_310 * fVar107;
      fVar284 = fStack_2cc * fVar247 + fStack_30c * fVar107;
      fVar205 = (fVar203 * (float)local_2e8._0_4_ + fVar70 * (float)local_328._0_4_) - fVar327;
      fVar218 = (fVar204 * (float)local_2e8._4_4_ + fVar70 * (float)local_328._4_4_) - fVar231;
      fVar261 = (fVar219 * fStack_2e0 + fVar107 * fStack_320) - fVar269;
      fVar264 = (fVar247 * fStack_2dc + fVar107 * fStack_31c) - fVar284;
      fVar203 = fVar109 * (fVar327 - fVar158) + fVar158;
      fVar204 = fVar109 * (fVar231 - fVar159) + fVar159;
      fVar219 = fVar109 * (fVar269 - fVar171) + fVar171;
      fVar247 = fVar109 * (fVar284 - fVar200) + fVar200;
      fVar220 = (fVar327 - fVar158) * fVar133 + fVar158;
      fVar236 = (fVar231 - fVar159) * fVar133 + fVar159;
      fVar281 = (fVar269 - fVar171) * fVar133 + fVar171;
      fVar289 = (fVar284 - fVar200) * fVar133 + fVar200;
      fVar301 = fVar109 * (fVar158 - fVar170) + fVar170;
      fVar304 = fVar109 * (fVar159 - fVar199) + fVar199;
      fVar307 = fVar109 * (fVar171 - fVar149) + fVar149;
      fVar310 = fVar109 * (fVar200 - fVar157) + fVar157;
      fVar301 = (fVar203 - fVar301) * fVar109 + fVar301;
      fVar304 = (fVar204 - fVar304) * fVar109 + fVar304;
      fVar307 = (fVar219 - fVar307) * fVar109 + fVar307;
      fVar310 = (fVar247 - fVar310) * fVar109 + fVar310;
      fVar203 = (((fVar109 * fVar205 + fVar327) - fVar203) * fVar109 + fVar203) - fVar301;
      fVar204 = (((fVar109 * fVar218 + fVar231) - fVar204) * fVar109 + fVar204) - fVar304;
      fVar219 = (((fVar109 * fVar261 + fVar269) - fVar219) * fVar109 + fVar219) - fVar307;
      fVar247 = (((fVar109 * fVar264 + fVar284) - fVar247) * fVar109 + fVar247) - fVar310;
      auVar145._0_4_ = fVar109 * fVar203 + fVar301;
      auVar145._4_4_ = fVar109 * fVar204 + fVar304;
      auVar145._8_4_ = fVar109 * fVar219 + fVar307;
      auVar145._12_4_ = fVar109 * fVar247 + fVar310;
      fVar301 = (float)DAT_01f7ff50;
      fVar304 = DAT_01f7ff50._4_4_;
      fVar307 = DAT_01f7ff50._8_4_;
      fVar310 = DAT_01f7ff50._12_4_;
      fVar170 = (fVar158 - fVar170) * fVar133 + fVar170;
      fVar199 = (fVar159 - fVar199) * fVar133 + fVar199;
      fVar149 = (fVar171 - fVar149) * fVar133 + fVar149;
      fVar157 = (fVar200 - fVar157) * fVar133 + fVar157;
      fVar170 = (fVar220 - fVar170) * fVar133 + fVar170;
      fVar199 = (fVar236 - fVar199) * fVar133 + fVar199;
      fVar149 = (fVar281 - fVar149) * fVar133 + fVar149;
      fVar157 = (fVar289 - fVar157) * fVar133 + fVar157;
      fVar158 = (((fVar205 * fVar133 + fVar327) - fVar220) * fVar133 + fVar220) - fVar170;
      fVar159 = (((fVar218 * fVar133 + fVar231) - fVar236) * fVar133 + fVar236) - fVar199;
      fVar171 = (((fVar261 * fVar133 + fVar269) - fVar281) * fVar133 + fVar281) - fVar149;
      fVar200 = (((fVar264 * fVar133 + fVar284) - fVar289) * fVar133 + fVar289) - fVar157;
      fVar170 = fVar133 * fVar158 + fVar170;
      fVar199 = fVar133 * fVar159 + fVar199;
      fVar109 = fVar133 * fVar171 + fVar149;
      fVar133 = fVar133 * fVar200 + fVar157;
      fVar149 = fVar134 * 0.33333334;
      fVar205 = fVar203 * fVar301 * fVar149 + auVar145._0_4_;
      fVar218 = fVar204 * fVar304 * fVar149 + auVar145._4_4_;
      fVar219 = fVar219 * fVar307 * fVar149 + auVar145._8_4_;
      fVar247 = fVar247 * fVar310 * fVar149 + auVar145._12_4_;
      fVar261 = fVar170 - fVar149 * fVar158 * fVar301;
      fVar264 = fVar199 - fVar149 * fVar159 * fVar304;
      fVar327 = fVar109 - fVar149 * fVar171 * fVar307;
      fVar220 = fVar133 - fVar149 * fVar200 * fVar310;
      auVar24._4_8_ = auVar333._8_8_;
      auVar24._0_4_ = auVar145._4_4_;
      auVar330._0_8_ = auVar24._0_8_ << 0x20;
      auVar330._8_4_ = auVar145._8_4_;
      auVar330._12_4_ = auVar145._12_4_;
      auVar331._8_8_ = auVar145._8_8_;
      auVar331._0_8_ = auVar330._8_8_;
      auVar25._4_8_ = DAT_01f7ff50._8_8_;
      auVar25._0_4_ = fVar199;
      auVar225._0_8_ = auVar25._0_8_ << 0x20;
      auVar225._8_4_ = fVar109;
      auVar225._12_4_ = fVar133;
      fVar171 = (fVar109 - fVar170) + (auVar145._8_4_ - auVar145._0_4_);
      fVar200 = (fVar133 - fVar199) + (auVar145._12_4_ - auVar145._4_4_);
      auVar256._0_4_ = fVar264 * fVar200;
      auVar256._4_4_ = fVar264 * fVar200;
      auVar256._8_4_ = fVar220 * fVar200;
      auVar256._12_4_ = fVar220 * fVar200;
      fVar149 = auVar145._0_4_ * fVar171 + auVar145._4_4_ * fVar200;
      fVar157 = auVar145._8_4_ * fVar171 + auVar145._12_4_ * fVar200;
      fVar203 = fVar205 * fVar171 + fVar218 * fVar200;
      fVar204 = fVar219 * fVar171 + fVar247 * fVar200;
      fVar231 = fVar261 * fVar171 + auVar256._0_4_;
      auVar213._0_8_ = CONCAT44(fVar264 * fVar171 + auVar256._4_4_,fVar231);
      auVar213._8_4_ = fVar327 * fVar171 + auVar256._8_4_;
      auVar213._12_4_ = fVar220 * fVar171 + auVar256._12_4_;
      fVar159 = fVar171 * fVar170 + fVar200 * fVar199;
      fVar236 = fVar171 * fVar109 + fVar200 * fVar133;
      auVar26._4_8_ = auVar256._8_8_;
      auVar26._0_4_ = fVar218 * fVar171 + fVar218 * fVar200;
      auVar257._0_8_ = auVar26._0_8_ << 0x20;
      auVar257._8_4_ = fVar204;
      auVar257._12_4_ = fVar247 * fVar171 + fVar247 * fVar200;
      fVar158 = fVar203;
      if (fVar203 <= fVar149) {
        fVar158 = fVar149;
        fVar149 = fVar203;
      }
      auVar258._8_8_ = auVar257._8_8_;
      auVar258._0_8_ = auVar258._8_8_;
      auVar95._8_4_ = auVar213._8_4_;
      auVar95._0_8_ = auVar213._0_8_;
      auVar95._12_4_ = auVar213._12_4_;
      if (fVar159 <= fVar231) {
        auVar95._0_4_ = fVar159;
      }
      if (auVar95._0_4_ <= fVar149) {
        fVar149 = auVar95._0_4_;
      }
      auVar27._4_8_ = auVar95._8_8_;
      auVar27._0_4_ = fVar171 * fVar199 + fVar200 * fVar199;
      auVar96._0_8_ = auVar27._0_8_ << 0x20;
      auVar96._8_4_ = fVar236;
      auVar96._12_4_ = fVar171 * fVar133 + fVar200 * fVar133;
      if (fVar159 <= fVar231) {
        fVar159 = fVar231;
      }
      auVar97._8_8_ = auVar96._8_8_;
      auVar97._0_8_ = auVar97._8_8_;
      if (fVar159 <= fVar158) {
        fVar159 = fVar158;
      }
      if (fVar204 <= fVar157) {
        auVar258._0_4_ = fVar157;
        fVar157 = fVar204;
      }
      auVar127._8_4_ = auVar213._8_4_;
      auVar127._0_8_ = auVar213._8_8_;
      auVar127._12_4_ = auVar213._12_4_;
      if (fVar236 <= auVar213._8_4_) {
        auVar127._0_4_ = fVar236;
      }
      if (auVar127._0_4_ <= fVar157) {
        fVar157 = auVar127._0_4_;
      }
      if (fVar236 <= auVar213._8_4_) {
        auVar97._0_4_ = auVar213._8_4_;
      }
      if (auVar97._0_4_ <= auVar258._0_4_) {
        auVar97._0_4_ = auVar258._0_4_;
      }
      bVar62 = 3 < (uint)uVar60;
      uVar28 = (undefined3)(uVar65 >> 8);
      uVar57 = (ulong)CONCAT31(uVar28,bVar62);
      fVar158 = auVar97._0_4_;
      if ((0.0001 <= fVar149) || (fVar158 <= -0.0001)) break;
      goto LAB_00b3167f;
    }
  } while( true );
  if ((fVar157 < 0.0001 && -0.0001 < fVar159) ||
     ((fVar149 < 0.0001 && -0.0001 < fVar159 ||
      (auVar333 = auVar331, fVar157 < 0.0001 && -0.0001 < fVar158)))) {
LAB_00b3167f:
    local_408 = (undefined1  [8])auVar225._8_8_;
    bVar62 = bVar62 || fVar134 < 0.001;
    uVar57 = (ulong)CONCAT31(uVar28,bVar62);
    fVar200 = (float)(~-(uint)(fVar149 < 0.0) & 0x3f800000 | -(uint)(fVar149 < 0.0) & 0xbf800000);
    fVar203 = (float)(~-(uint)(fVar159 < 0.0) & 0x3f800000 | -(uint)(fVar159 < 0.0) & 0xbf800000);
    fVar171 = 0.0;
    if ((fVar200 == fVar203) && (!NAN(fVar200) && !NAN(fVar203))) {
      fVar171 = INFINITY;
    }
    fVar204 = 0.0;
    if ((fVar200 == fVar203) && (!NAN(fVar200) && !NAN(fVar203))) {
      fVar204 = -INFINITY;
    }
    fVar231 = (float)(~-(uint)(fVar157 < 0.0) & 0x3f800000 | -(uint)(fVar157 < 0.0) & 0xbf800000);
    if ((fVar200 != fVar231) || (fVar236 = fVar204, NAN(fVar200) || NAN(fVar231))) {
      if ((fVar157 != fVar149) || (NAN(fVar157) || NAN(fVar149))) {
        fVar157 = -fVar149 / (fVar157 - fVar149);
        fVar157 = (1.0 - fVar157) * 0.0 + fVar157;
        fVar236 = fVar157;
      }
      else {
        fVar157 = 0.0;
        if ((fVar149 != 0.0) || (fVar236 = 1.0, NAN(fVar149))) {
          fVar157 = INFINITY;
          fVar236 = -INFINITY;
        }
      }
      if (fVar157 <= fVar171) {
        fVar171 = fVar157;
      }
      if (fVar236 <= fVar204) {
        fVar236 = fVar204;
      }
    }
    fVar149 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar158 < 0.0) * 4);
    if ((fVar203 != fVar149) || (fVar157 = fVar236, NAN(fVar203) || NAN(fVar149))) {
      if ((fVar158 != fVar159) || (NAN(fVar158) || NAN(fVar159))) {
        fVar200 = -fVar159 / (fVar158 - fVar159);
        fVar200 = (1.0 - fVar200) * 0.0 + fVar200;
        fVar157 = fVar200;
      }
      else {
        fVar200 = 0.0;
        if ((fVar159 != 0.0) || (fVar157 = 1.0, NAN(fVar159))) {
          fVar200 = INFINITY;
          fVar157 = -INFINITY;
        }
      }
      if (fVar200 <= fVar171) {
        fVar171 = fVar200;
      }
      if (fVar157 <= fVar236) {
        fVar157 = fVar236;
      }
    }
    if ((fVar231 != fVar149) || (NAN(fVar231) || NAN(fVar149))) {
      fVar171 = (float)(~-(uint)(fVar171 < 1.0) & 0x3f800000 |
                       (uint)fVar171 & -(uint)(fVar171 < 1.0));
      fVar157 = (float)(~-(uint)(fVar157 < 1.0) & (uint)fVar157 |
                       -(uint)(fVar157 < 1.0) & 0x3f800000);
    }
    fVar171 = (float)(~-(uint)(fVar171 < 0.0) & (uint)fVar171);
    fVar149 = (float)(~-(uint)(fVar157 < 1.0) & 0x3f800000 | (uint)fVar157 & -(uint)(fVar157 < 1.0))
    ;
    auVar333 = _DAT_01f7ff50;
    _local_338 = auVar331;
    if (fVar171 <= fVar149) {
      fVar171 = fVar171 + -0.1;
      fVar149 = fVar149 + 0.1;
      uVar65 = -(uint)(fVar149 < 1.0);
      fVar171 = (float)(~-(uint)(fVar171 < 0.0) & (uint)fVar171);
      fVar149 = (float)(~uVar65 & 0x3f800000 | (uint)fVar149 & uVar65);
      fVar236 = 1.0 - fVar171;
      fVar269 = 1.0 - fVar171;
      fVar281 = 1.0 - fVar149;
      fVar284 = 1.0 - fVar149;
      fStack_400 = auVar71._8_4_;
      fStack_3fc = auVar71._12_4_;
      fVar157 = auVar145._0_4_ * fVar236 + auVar145._8_4_ * fVar171;
      fVar159 = auVar145._4_4_ * fVar269 + auVar145._12_4_ * fVar171;
      fVar200 = auVar145._0_4_ * fVar281 + auVar145._8_4_ * fVar149;
      fVar203 = auVar145._4_4_ * fVar284 + auVar145._12_4_ * fVar149;
      fVar204 = fVar205 * fVar236 + fVar219 * fVar171;
      fVar231 = fVar218 * fVar269 + fVar247 * fVar171;
      fVar205 = fVar205 * fVar281 + fVar219 * fVar149;
      fVar218 = fVar218 * fVar284 + fVar247 * fVar149;
      fVar219 = fVar261 * fVar236 + fVar327 * fVar171;
      fVar247 = fVar264 * fVar269 + fVar220 * fVar171;
      fVar261 = fVar261 * fVar281 + fVar327 * fVar149;
      fVar264 = fVar264 * fVar284 + fVar220 * fVar149;
      fVar327 = fVar236 * fVar170 + fVar109 * fVar171;
      fVar220 = fVar269 * fVar199 + fVar133 * fVar171;
      fVar170 = fVar281 * fVar170 + fStack_400 * fVar149;
      fVar199 = fVar284 * fVar199 + fStack_3fc * fVar149;
      fVar236 = fVar70 * (1.0 - fVar149);
      fVar70 = fVar70 * (1.0 - fVar171) + fVar107 * fVar171;
      fVar107 = fVar236 + fVar107 * fVar149;
      fVar134 = 1.0 / fVar134;
      auVar128._0_4_ = fVar170 - fVar327;
      auVar128._4_4_ = fVar199 - fVar220;
      auVar128._8_4_ = fVar170 - fVar170;
      auVar128._12_4_ = fVar199 - fVar199;
      auVar155._0_8_ = CONCAT44(fVar264 - fVar247,fVar261 - fVar219);
      auVar155._8_4_ = fVar261 - fVar261;
      auVar155._12_4_ = fVar264 - fVar264;
      auVar193._0_4_ = fVar205 - fVar204;
      auVar193._4_4_ = fVar218 - fVar231;
      auVar193._8_4_ = fVar205 - fVar205;
      auVar193._12_4_ = fVar218 - fVar218;
      auVar259._0_8_ = CONCAT44((fVar231 - fVar159) * fVar304,(fVar204 - fVar157) * fVar301);
      auVar259._8_4_ = (fVar205 - fVar200) * fVar307;
      auVar259._12_4_ = (fVar218 - fVar203) * fVar310;
      auVar166._0_8_ = CONCAT44((fVar247 - fVar231) * fVar304,(fVar219 - fVar204) * fVar301);
      auVar166._8_4_ = (fVar261 - fVar205) * fVar307;
      auVar166._12_4_ = (fVar264 - fVar218) * fVar310;
      auVar297._0_4_ = (fVar327 - fVar219) * fVar301;
      auVar297._4_4_ = (fVar220 - fVar247) * fVar304;
      auVar297._8_4_ = (fVar170 - fVar261) * fVar307;
      auVar297._12_4_ = (fVar199 - fVar264) * fVar310;
      auVar214._8_4_ = auVar166._8_4_;
      auVar214._0_8_ = auVar166._0_8_;
      auVar214._12_4_ = auVar166._12_4_;
      auVar137 = minps(auVar214,auVar297);
      auVar71 = maxps(auVar166,auVar297);
      auVar277._8_4_ = auVar259._8_4_;
      auVar277._0_8_ = auVar259._0_8_;
      auVar277._12_4_ = auVar259._12_4_;
      auVar139 = minps(auVar277,auVar137);
      auVar123 = maxps(auVar259,auVar71);
      auVar29._4_8_ = auVar71._8_8_;
      auVar29._0_4_ = auVar139._4_4_;
      auVar167._0_8_ = auVar29._0_8_ << 0x20;
      auVar167._8_4_ = auVar139._8_4_;
      auVar167._12_4_ = auVar139._12_4_;
      auVar168._8_8_ = auVar139._8_8_;
      auVar168._0_8_ = auVar167._8_8_;
      auVar30._4_8_ = auVar137._8_8_;
      auVar30._0_4_ = auVar123._4_4_;
      auVar215._0_8_ = auVar30._0_8_ << 0x20;
      auVar215._8_4_ = auVar123._8_4_;
      auVar215._12_4_ = auVar123._12_4_;
      auVar216._8_8_ = auVar123._8_8_;
      auVar216._0_8_ = auVar215._8_8_;
      auVar137 = minps(auVar139,auVar168);
      auVar71 = maxps(auVar123,auVar216);
      fVar321 = auVar137._0_4_ * fVar134;
      fVar323 = auVar137._4_4_ * fVar134;
      fVar325 = auVar137._8_4_ * fVar134;
      fVar328 = auVar137._12_4_ * fVar134;
      fVar247 = fVar134 * auVar71._0_4_;
      fVar264 = fVar134 * auVar71._4_4_;
      fVar220 = fVar134 * auVar71._8_4_;
      fVar134 = fVar134 * auVar71._12_4_;
      fVar284 = 1.0 / (fVar107 - fVar70);
      auVar98._0_8_ = CONCAT44(fVar203 - fVar159,fVar200 - fVar157);
      auVar98._8_4_ = fVar200 - fVar200;
      auVar98._12_4_ = fVar203 - fVar203;
      auVar226._8_4_ = auVar98._8_4_;
      auVar226._0_8_ = auVar98._0_8_;
      auVar226._12_4_ = auVar98._12_4_;
      auVar123 = minps(auVar226,auVar193);
      auVar71 = maxps(auVar98,auVar193);
      auVar146._8_4_ = auVar155._8_4_;
      auVar146._0_8_ = auVar155._0_8_;
      auVar146._12_4_ = auVar155._12_4_;
      auVar137 = minps(auVar146,auVar128);
      auVar123 = minps(auVar123,auVar137);
      auVar137 = maxps(auVar155,auVar128);
      auVar71 = maxps(auVar71,auVar137);
      fVar269 = auVar123._0_4_ * fVar284;
      fVar281 = auVar123._4_4_ * fVar284;
      fVar289 = fVar284 * auVar71._0_4_;
      fVar284 = fVar284 * auVar71._4_4_;
      local_408._4_4_ = fVar70;
      local_408._0_4_ = fVar109;
      fStack_400 = fVar133;
      fStack_3fc = fVar107;
      auVar217._4_4_ = fVar107;
      auVar217._0_4_ = fVar133;
      auVar217._8_4_ = fVar147;
      auVar217._12_4_ = fVar135;
      fVar204 = (fVar109 + fVar133) * 0.5;
      fVar205 = (fVar70 + fVar107) * 0.5;
      fVar218 = (fVar133 + fVar147) * 0.0;
      fVar219 = (fVar107 + fVar135) * 0.0;
      fVar149 = local_88 * fVar204 + (float)local_1f8;
      fVar157 = fStack_84 * fVar204 + local_1f8._4_4_;
      fVar159 = fStack_80 * fVar204 + fStack_1f0;
      fVar170 = fStack_7c * fVar204 + fStack_1ec;
      fVar171 = local_98 * fVar204 + local_298;
      fVar199 = fStack_94 * fVar204 + fStack_294;
      fVar200 = fStack_90 * fVar204 + (float)uStack_290;
      fVar203 = fStack_8c * fVar204 + uStack_290._4_4_;
      fVar149 = (fVar171 - fVar149) * fVar204 + fVar149;
      fVar157 = (fVar199 - fVar157) * fVar204 + fVar157;
      fVar159 = (fVar200 - fVar159) * fVar204 + fVar159;
      fVar170 = (fVar203 - fVar170) * fVar204 + fVar170;
      fVar171 = (((local_a8 * fVar204 + (float)local_2a8) - fVar171) * fVar204 + fVar171) - fVar149;
      fVar199 = (((fStack_a4 * fVar204 + local_2a8._4_4_) - fVar199) * fVar204 + fVar199) - fVar157;
      fVar200 = (((fStack_a0 * fVar204 + fStack_2a0) - fVar200) * fVar204 + fVar200) - fVar159;
      fVar203 = (((fStack_9c * fVar204 + fStack_29c) - fVar203) * fVar204 + fVar203) - fVar170;
      fVar149 = fVar204 * fVar171 + fVar149;
      fVar157 = fVar204 * fVar199 + fVar157;
      fVar171 = fVar171 * fVar301;
      fVar199 = fVar199 * fVar304;
      fVar159 = (fVar204 * fVar200 + fVar159) - fVar149;
      fVar170 = (fVar204 * fVar203 + fVar170) - fVar157;
      fVar171 = (fVar200 * fVar307 - fVar171) * fVar205 + fVar171;
      fVar199 = (fVar203 * fVar310 - fVar199) * fVar205 + fVar199;
      auVar156._0_8_ = CONCAT44(fVar171,fVar159) ^ 0x80000000;
      auVar156._8_4_ = fVar171;
      auVar156._12_4_ = fVar171;
      fVar301 = fVar109 - fVar204;
      fVar304 = fVar70 - fVar205;
      fVar307 = fVar133 - fVar218;
      fVar310 = fVar107 - fVar219;
      fVar334 = fVar133 - fVar204;
      fVar336 = fVar107 - fVar205;
      fVar147 = fVar147 - fVar218;
      fVar135 = fVar135 - fVar219;
      fVar149 = fVar159 * fVar205 + fVar149;
      fVar157 = fVar170 * fVar205 + fVar157;
      auVar169._0_8_ = CONCAT44(fVar199,fVar170) ^ 0x8000000000000000;
      auVar169._8_4_ = -fVar199;
      auVar169._12_4_ = -fVar199;
      auVar99._0_4_ = fVar170 * fVar171 - fVar199 * fVar159;
      auVar99._4_4_ = auVar99._0_4_;
      auVar99._8_4_ = auVar99._0_4_;
      auVar99._12_4_ = auVar99._0_4_;
      auVar137 = divps(auVar169,auVar99);
      auVar71 = divps(auVar156,auVar99);
      fVar218 = auVar137._0_4_;
      fVar219 = auVar137._4_4_;
      fVar200 = auVar71._0_4_;
      fVar203 = auVar71._4_4_;
      fVar204 = fVar204 - (fVar157 * fVar200 + fVar149 * fVar218);
      fVar171 = fVar205 - (fVar157 * fVar203 + fVar149 * fVar219);
      fVar199 = fVar205 - (fVar157 * auVar71._8_4_ + fVar149 * auVar137._8_4_);
      fVar205 = fVar205 - (fVar157 * auVar71._12_4_ + fVar149 * auVar137._12_4_);
      auVar129._0_8_ = CONCAT44(fVar219 * fVar269,fVar219 * fVar321);
      auVar129._8_4_ = fVar219 * fVar323;
      auVar129._12_4_ = fVar219 * fVar281;
      auVar100._0_4_ = fVar219 * fVar247;
      auVar100._4_4_ = fVar219 * fVar289;
      auVar100._8_4_ = fVar219 * fVar264;
      auVar100._12_4_ = fVar219 * fVar284;
      auVar343._8_4_ = auVar129._8_4_;
      auVar343._0_8_ = auVar129._0_8_;
      auVar343._12_4_ = auVar129._12_4_;
      auVar139 = minps(auVar343,auVar100);
      auVar71 = maxps(auVar100,auVar129);
      auVar194._0_8_ = CONCAT44(fVar203 * fVar281,fVar203 * fVar323);
      auVar194._8_4_ = fVar203 * fVar325;
      auVar194._12_4_ = fVar203 * fVar328;
      auVar130._0_4_ = fVar203 * fVar264;
      auVar130._4_4_ = fVar203 * fVar284;
      auVar130._8_4_ = fVar203 * fVar220;
      auVar130._12_4_ = fVar203 * fVar134;
      auVar278._8_4_ = auVar194._8_4_;
      auVar278._0_8_ = auVar194._0_8_;
      auVar278._12_4_ = auVar194._12_4_;
      auVar123 = minps(auVar278,auVar130);
      auVar137 = maxps(auVar130,auVar194);
      fVar149 = 0.0 - (auVar137._0_4_ + auVar71._0_4_);
      fVar157 = 1.0 - (auVar137._4_4_ + auVar71._4_4_);
      fVar159 = 0.0 - (auVar137._8_4_ + auVar71._8_4_);
      fVar170 = 0.0 - (auVar137._12_4_ + auVar71._12_4_);
      fVar261 = 0.0 - (auVar123._0_4_ + auVar139._0_4_);
      fVar327 = 1.0 - (auVar123._4_4_ + auVar139._4_4_);
      fVar231 = 0.0 - (auVar123._8_4_ + auVar139._8_4_);
      fVar236 = 0.0 - (auVar123._12_4_ + auVar139._12_4_);
      auVar131._0_8_ = CONCAT44(fVar304 * fVar157,fVar301 * fVar149);
      auVar131._8_4_ = fVar307 * fVar159;
      auVar131._12_4_ = fVar310 * fVar170;
      auVar298._0_8_ = CONCAT44(fVar269 * fVar218,fVar321 * fVar218);
      auVar298._8_4_ = fVar323 * fVar218;
      auVar298._12_4_ = fVar281 * fVar218;
      auVar195._0_4_ = fVar218 * fVar247;
      auVar195._4_4_ = fVar218 * fVar289;
      auVar195._8_4_ = fVar218 * fVar264;
      auVar195._12_4_ = fVar218 * fVar284;
      auVar279._8_4_ = auVar298._8_4_;
      auVar279._0_8_ = auVar298._0_8_;
      auVar279._12_4_ = auVar298._12_4_;
      auVar137 = minps(auVar279,auVar195);
      auVar71 = maxps(auVar195,auVar298);
      auVar227._0_8_ = CONCAT44(fVar281 * fVar200,fVar323 * fVar200);
      auVar227._8_4_ = fVar325 * fVar200;
      auVar227._12_4_ = fVar328 * fVar200;
      auVar299._0_4_ = fVar200 * fVar264;
      auVar299._4_4_ = fVar200 * fVar284;
      auVar299._8_4_ = fVar200 * fVar220;
      auVar299._12_4_ = fVar200 * fVar134;
      auVar342._8_4_ = auVar227._8_4_;
      auVar342._0_8_ = auVar227._0_8_;
      auVar342._12_4_ = auVar227._12_4_;
      auVar139 = minps(auVar342,auVar299);
      auVar280._0_4_ = fVar301 * fVar261;
      auVar280._4_4_ = fVar304 * fVar327;
      auVar280._8_4_ = fVar307 * fVar231;
      auVar280._12_4_ = fVar310 * fVar236;
      auVar101._0_8_ = CONCAT44(fVar157 * fVar336,fVar149 * fVar334);
      auVar101._8_4_ = fVar159 * fVar147;
      auVar101._12_4_ = fVar170 * fVar135;
      auVar202._0_4_ = fVar261 * fVar334;
      auVar202._4_4_ = fVar327 * fVar336;
      auVar202._8_4_ = fVar231 * fVar147;
      auVar202._12_4_ = fVar236 * fVar135;
      auVar123 = maxps(auVar299,auVar227);
      fVar134 = 1.0 - (auVar123._0_4_ + auVar71._0_4_);
      fVar149 = 0.0 - (auVar123._4_4_ + auVar71._4_4_);
      fVar157 = 0.0 - (auVar123._8_4_ + auVar71._8_4_);
      fVar159 = 0.0 - (auVar123._12_4_ + auVar71._12_4_);
      fVar170 = 1.0 - (auVar139._0_4_ + auVar137._0_4_);
      fVar247 = 0.0 - (auVar139._4_4_ + auVar137._4_4_);
      fVar261 = 0.0 - (auVar139._8_4_ + auVar137._8_4_);
      fVar264 = 0.0 - (auVar139._12_4_ + auVar137._12_4_);
      auVar228._0_8_ = CONCAT44(fVar304 * fVar149,fVar301 * fVar134);
      auVar228._8_4_ = fVar307 * fVar157;
      auVar228._12_4_ = fVar310 * fVar159;
      auVar320._0_4_ = fVar301 * fVar170;
      auVar320._4_4_ = fVar304 * fVar247;
      auVar320._8_4_ = fVar307 * fVar261;
      auVar320._12_4_ = fVar310 * fVar264;
      auVar196._0_8_ = CONCAT44(fVar149 * fVar336,fVar134 * fVar334);
      auVar196._8_4_ = fVar157 * fVar147;
      auVar196._12_4_ = fVar159 * fVar135;
      auVar260._0_4_ = fVar170 * fVar334;
      auVar260._4_4_ = fVar247 * fVar336;
      auVar260._8_4_ = fVar261 * fVar147;
      auVar260._12_4_ = fVar264 * fVar135;
      auVar300._8_4_ = auVar228._8_4_;
      auVar300._0_8_ = auVar228._0_8_;
      auVar300._12_4_ = auVar228._12_4_;
      auVar71 = minps(auVar300,auVar320);
      auVar332._8_4_ = auVar196._8_4_;
      auVar332._0_8_ = auVar196._0_8_;
      auVar332._12_4_ = auVar196._12_4_;
      auVar333 = minps(auVar332,auVar260);
      auVar255 = minps(auVar71,auVar333);
      auVar137 = maxps(auVar320,auVar228);
      auVar71 = maxps(auVar260,auVar196);
      auVar123 = maxps(auVar71,auVar137);
      auVar229._8_4_ = auVar131._8_4_;
      auVar229._0_8_ = auVar131._0_8_;
      auVar229._12_4_ = auVar131._12_4_;
      auVar137 = minps(auVar229,auVar280);
      auVar197._8_4_ = auVar101._8_4_;
      auVar197._0_8_ = auVar101._0_8_;
      auVar197._12_4_ = auVar101._12_4_;
      auVar71 = minps(auVar197,auVar202);
      auVar137 = minps(auVar137,auVar71);
      auVar139 = maxps(auVar280,auVar131);
      auVar71 = maxps(auVar202,auVar101);
      auVar71 = maxps(auVar71,auVar139);
      auVar230._0_4_ = auVar255._4_4_ + auVar255._0_4_ + fVar204;
      auVar230._4_4_ = auVar137._4_4_ + auVar137._0_4_ + fVar171;
      auVar230._8_4_ = auVar255._8_4_ + auVar255._4_4_ + fVar199;
      auVar230._12_4_ = auVar255._12_4_ + auVar137._4_4_ + fVar205;
      fVar134 = auVar123._4_4_ + auVar123._0_4_ + fVar204;
      fVar135 = auVar71._4_4_ + auVar71._0_4_ + fVar171;
      auVar102._4_4_ = fVar135;
      auVar102._0_4_ = fVar134;
      auVar137 = maxps(_local_408,auVar230);
      auVar102._8_4_ = auVar123._8_4_ + auVar123._4_4_ + fVar199;
      auVar102._12_4_ = auVar123._12_4_ + auVar71._4_4_ + fVar205;
      auVar71 = minps(auVar102,auVar217);
      iVar64 = -(uint)(auVar71._0_4_ < auVar137._0_4_);
      iVar66 = -(uint)(auVar71._4_4_ < auVar137._4_4_);
      auVar104._4_4_ = iVar66;
      auVar104._0_4_ = iVar64;
      auVar104._8_4_ = iVar66;
      auVar104._12_4_ = iVar66;
      auVar103._8_8_ = auVar104._8_8_;
      auVar103._4_4_ = iVar64;
      auVar103._0_4_ = iVar64;
      iVar64 = movmskpd((uint)(fVar158 < 0.0),auVar103);
      if (iVar64 == 0) {
        bVar54 = 0;
        if ((fVar109 < auVar230._0_4_) && (fVar134 < fVar133)) {
          bVar54 = -(fVar135 < fVar107) & fVar70 < auVar230._4_4_;
        }
        bVar54 = bVar62 | bVar54;
        uVar57 = (ulong)CONCAT31(uVar28,bVar54);
        if (bVar54 != 1) goto LAB_00b30cbf;
        uVar57 = 200;
        do {
          fVar70 = 1.0 - fVar204;
          fVar134 = fVar204 * fVar204 * fVar204;
          fVar133 = fVar204 * fVar204 * 3.0 * fVar70;
          fVar107 = fVar70 * fVar70 * fVar70;
          fVar135 = fVar204 * 3.0 * fVar70 * fVar70;
          fVar109 = fVar107 * (float)local_1f8 +
                    fVar135 * local_298 + fVar133 * (float)local_2a8 + fVar134 * fVar172;
          fVar70 = fVar107 * local_1f8._4_4_ +
                   fVar135 * fStack_294 + fVar133 * local_2a8._4_4_ + fVar134 * fVar198;
          fVar109 = ((fVar107 * fStack_1f0 +
                     fVar135 * (float)uStack_290 + fVar133 * fStack_2a0 + fVar134 * fVar108) -
                    fVar109) * fVar171 + fVar109;
          fVar70 = ((fVar107 * fStack_1ec +
                    fVar135 * uStack_290._4_4_ + fVar133 * fStack_29c + fVar134 * fVar148) - fVar70)
                   * fVar171 + fVar70;
          fVar204 = fVar204 - (fVar70 * fVar200 + fVar109 * fVar218);
          fVar171 = fVar171 - (fVar70 * fVar203 + fVar109 * fVar219);
          fVar109 = (float)((uint)fVar109 & (uint)DAT_01f7b6c0);
          fVar70 = (float)((uint)fVar70 & DAT_01f7b6c0._4_4_);
          if (fVar70 <= fVar109) {
            fVar70 = fVar109;
          }
          auVar333 = _DAT_01f7b6c0;
          if (fVar70 < local_288) {
            if ((((0.0 <= fVar204) && (fVar204 <= 1.0)) && (0.0 <= fVar171)) && (fVar171 <= 1.0)) {
              fVar70 = (pre->ray_space).vx.field_0.m128[2];
              fVar107 = (pre->ray_space).vy.field_0.m128[2];
              fVar109 = (pre->ray_space).vz.field_0.m128[2];
              fVar133 = (ray->org).field_0.m128[0];
              fVar134 = (ray->org).field_0.m128[1];
              fVar135 = (ray->org).field_0.m128[2];
              fVar170 = 1.0 - fVar171;
              fVar159 = 1.0 - fVar204;
              fVar147 = fVar159 * fVar159 * fVar159;
              fVar149 = fVar204 * 3.0 * fVar159 * fVar159;
              fVar158 = fVar204 * fVar204 * fVar204;
              fVar157 = fVar204 * fVar204 * 3.0 * fVar159;
              fVar70 = (((fStack_360 - fVar135) * fVar109 +
                        (fStack_364 - fVar134) * fVar107 + (local_368 - fVar133) * fVar70) * fVar170
                       + ((fStack_350 - fVar135) * fVar109 +
                         (fStack_354 - fVar134) * fVar107 + (local_358 - fVar133) * fVar70) *
                         fVar171) * fVar147 +
                       (((fStack_370 - fVar135) * fVar109 +
                        (fStack_374 - fVar134) * fVar107 + (local_378 - fVar133) * fVar70) * fVar170
                       + ((fStack_3b0 - fVar135) * fVar109 +
                         (fStack_3b4 - fVar134) * fVar107 + (local_3b8 - fVar133) * fVar70) *
                         fVar171) * fVar149 +
                       (((fStack_390 - fVar135) * fVar109 +
                        (fStack_394 - fVar134) * fVar107 + (local_398 - fVar133) * fVar70) * fVar170
                       + ((fStack_3c0 - fVar135) * fVar109 +
                         (fStack_3c4 - fVar134) * fVar107 + (local_3c8 - fVar133) * fVar70) *
                         fVar171) * fVar157 +
                       (fVar170 * ((fStack_380 - fVar135) * fVar109 +
                                  (fStack_384 - fVar134) * fVar107 + (local_388 - fVar133) * fVar70)
                       + ((fStack_200 - fVar135) * fVar109 +
                         (fStack_204 - fVar134) * fVar107 + (local_208 - fVar133) * fVar70) *
                         fVar171) * fVar158;
              if ((ray->org).field_0.m128[3] <= fVar70) {
                fVar107 = ray->tfar;
                auVar333 = ZEXT416((uint)fVar107);
                if (fVar70 <= fVar107) {
                  fVar135 = 1.0 - fVar171;
                  fVar170 = 1.0 - fVar171;
                  fVar199 = 1.0 - fVar171;
                  fVar109 = local_378 * fVar135 + local_3b8 * fVar171;
                  fVar133 = fStack_374 * fVar170 + fStack_3b4 * fVar171;
                  fVar134 = fStack_370 * fVar199 + fStack_3b0 * fVar171;
                  fVar200 = local_398 * fVar135 + local_3c8 * fVar171;
                  fVar205 = fStack_394 * fVar170 + fStack_3c4 * fVar171;
                  fVar219 = fStack_390 * fVar199 + fStack_3c0 * fVar171;
                  fVar203 = fVar200 - fVar109;
                  fVar218 = fVar205 - fVar133;
                  fVar247 = fVar219 - fVar134;
                  fVar109 = (((fVar109 - (local_368 * fVar135 + local_358 * fVar171)) * fVar159 +
                             fVar204 * fVar203) * fVar159 +
                            (fVar203 * fVar159 +
                            ((fVar135 * local_388 + fVar171 * local_208) - fVar200) * fVar204) *
                            fVar204) * 3.0;
                  fVar133 = (((fVar133 - (fStack_364 * fVar170 + fStack_354 * fVar171)) * fVar159 +
                             fVar204 * fVar218) * fVar159 +
                            (fVar218 * fVar159 +
                            ((fVar170 * fStack_384 + fVar171 * fStack_204) - fVar205) * fVar204) *
                            fVar204) * 3.0;
                  fVar134 = (((fVar134 - (fStack_360 * fVar199 + fStack_350 * fVar171)) * fVar159 +
                             fVar204 * fVar247) * fVar159 +
                            (fVar247 * fVar159 +
                            ((fVar199 * fStack_380 + fVar171 * fStack_200) - fVar219) * fVar204) *
                            fVar204) * 3.0;
                  pGVar14 = (context->scene->geometries).items[local_340].ptr;
                  if ((pGVar14->mask & ray->mask) == 0) {
LAB_00b3234c:
                    uVar57 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (uVar57 = CONCAT71((int7)((ulong)context->args >> 8),1),
                          pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar135 = fVar147 * local_178 +
                              fVar149 * local_188 + fVar157 * local_198 + fVar158 * local_1a8;
                    fVar159 = fVar147 * fStack_174 +
                              fVar149 * fStack_184 + fVar157 * fStack_194 + fVar158 * fStack_1a4;
                    fVar147 = fVar147 * fStack_170 +
                              fVar149 * fStack_180 + fVar157 * fStack_190 + fVar158 * fStack_1a0;
                    local_1d8 = CONCAT44(fVar135 * fVar134 - fVar109 * fVar147,
                                         fVar147 * fVar133 - fVar134 * fVar159);
                    local_1d0 = fVar159 * fVar109 - fVar133 * fVar135;
                    local_1cc = fVar204;
                    fStack_1c8 = fVar171;
                    local_1c4 = (int)local_278;
                    local_1c0 = (int)local_340;
                    local_1bc = context->user->instID[0];
                    local_1b8 = context->user->instPrimID[0];
                    ray->tfar = fVar70;
                    local_3cc = 0xffffffff;
                    local_268.valid = &local_3cc;
                    local_268.geometryUserPtr = pGVar14->userPtr;
                    local_268.context = context->user;
                    local_268.hit = (RTCHitN *)&local_1d8;
                    local_268.N = 1;
                    local_3a8._0_4_ = (int)uVar56;
                    local_268.ray = (RTCRayN *)ray;
                    if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar14->occlusionFilterN)(&local_268);
                      uVar56 = (ulong)(uint)local_3a8._0_4_;
                      if (*local_268.valid != 0) goto LAB_00b322fa;
LAB_00b32340:
                      ray->tfar = fVar107;
                      goto LAB_00b3234c;
                    }
LAB_00b322fa:
                    p_Var58 = context->args->filter;
                    if ((p_Var58 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var58)(&local_268);
                      uVar56 = (ulong)(uint)local_3a8._0_4_;
                      p_Var58 = (RTCFilterFunctionN)local_268.valid;
                      if (*local_268.valid == 0) goto LAB_00b32340;
                    }
                    uVar57 = CONCAT71((int7)((ulong)p_Var58 >> 8),1);
                  }
                  uVar56 = CONCAT71((int7)(uVar56 >> 8),(byte)uVar56 | (byte)uVar57);
                }
              }
            }
            break;
          }
          uVar57 = uVar57 - 1;
        } while (uVar57 != 0);
      }
    }
  }
  goto LAB_00b3131f;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }